

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  void *pvVar5;
  __int_type_conflict _Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  int iVar48;
  ulong uVar49;
  byte bVar50;
  uint uVar51;
  long lVar52;
  uint uVar53;
  uint uVar54;
  ulong uVar56;
  ulong uVar57;
  bool bVar58;
  float fVar59;
  undefined4 uVar60;
  float fVar61;
  float fVar85;
  float fVar87;
  vint4 bi_2;
  undefined1 auVar62 [16];
  float fVar89;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar86;
  float fVar88;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar90;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined8 uVar91;
  vint4 bi_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  vint4 ai_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar133;
  float fVar142;
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  vint4 bi;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  float fVar158;
  float fVar159;
  float fVar176;
  float fVar177;
  vfloat4 b0_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar178;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  float fVar190;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar182 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar191;
  undefined1 auVar189 [32];
  float fVar195;
  float fVar206;
  vint4 ai_1;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar207;
  float fVar221;
  vfloat4 a0_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar222;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  vfloat4 a0_3;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar243;
  float fVar257;
  float fVar258;
  vfloat4 a0_1;
  undefined1 auVar248 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar259;
  undefined1 auVar246 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar247 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  vfloat4 a0;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar271 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar283 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined4 local_530;
  undefined4 local_520;
  uint auStack_500 [4];
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  uint uStack_320;
  float afStack_31c [7];
  undefined1 local_300 [32];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar55;
  undefined1 auVar282 [32];
  
  PVar2 = prim[1];
  uVar56 = (ulong)(byte)PVar2;
  fVar59 = *(float *)(prim + uVar56 * 0x19 + 0x12);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar56 * 0x19 + 6));
  auVar62._0_4_ = fVar59 * auVar7._0_4_;
  auVar62._4_4_ = fVar59 * auVar7._4_4_;
  auVar62._8_4_ = fVar59 * auVar7._8_4_;
  auVar62._12_4_ = fVar59 * auVar7._12_4_;
  auVar73._0_4_ = fVar59 * auVar8._0_4_;
  auVar73._4_4_ = fVar59 * auVar8._4_4_;
  auVar73._8_4_ = fVar59 * auVar8._8_4_;
  auVar73._12_4_ = fVar59 * auVar8._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar279 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 6 + 6)));
  auVar279 = vcvtdq2ps_avx(auVar279);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar56 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar49 = (ulong)(uint)((int)(uVar56 * 9) * 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 + uVar56 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  uVar49 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar269._4_4_ = auVar73._0_4_;
  auVar269._0_4_ = auVar73._0_4_;
  auVar269._8_4_ = auVar73._0_4_;
  auVar269._12_4_ = auVar73._0_4_;
  auVar93 = vshufps_avx(auVar73,auVar73,0x55);
  auVar63 = vshufps_avx(auVar73,auVar73,0xaa);
  fVar59 = auVar63._0_4_;
  auVar237._0_4_ = fVar59 * auVar279._0_4_;
  fVar85 = auVar63._4_4_;
  auVar237._4_4_ = fVar85 * auVar279._4_4_;
  fVar87 = auVar63._8_4_;
  auVar237._8_4_ = fVar87 * auVar279._8_4_;
  fVar89 = auVar63._12_4_;
  auVar237._12_4_ = fVar89 * auVar279._12_4_;
  auVar124._0_4_ = auVar12._0_4_ * fVar59;
  auVar124._4_4_ = auVar12._4_4_ * fVar85;
  auVar124._8_4_ = auVar12._8_4_ * fVar87;
  auVar124._12_4_ = auVar12._12_4_ * fVar89;
  auVar239._0_4_ = auVar111._0_4_ * fVar59;
  auVar239._4_4_ = auVar111._4_4_ * fVar85;
  auVar239._8_4_ = auVar111._8_4_ * fVar87;
  auVar239._12_4_ = auVar111._12_4_ * fVar89;
  auVar63 = vfmadd231ps_fma(auVar237,auVar93,auVar8);
  auVar94 = vfmadd231ps_fma(auVar124,auVar93,auVar11);
  auVar93 = vfmadd231ps_fma(auVar239,auVar64,auVar93);
  auVar121 = vfmadd231ps_fma(auVar63,auVar269,auVar7);
  auVar94 = vfmadd231ps_fma(auVar94,auVar269,auVar10);
  auVar134 = vfmadd231ps_fma(auVar93,auVar65,auVar269);
  auVar270._4_4_ = auVar62._0_4_;
  auVar270._0_4_ = auVar62._0_4_;
  auVar270._8_4_ = auVar62._0_4_;
  auVar270._12_4_ = auVar62._0_4_;
  auVar93 = vshufps_avx(auVar62,auVar62,0x55);
  auVar63 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar59 = auVar63._0_4_;
  auVar143._0_4_ = fVar59 * auVar279._0_4_;
  fVar85 = auVar63._4_4_;
  auVar143._4_4_ = fVar85 * auVar279._4_4_;
  fVar87 = auVar63._8_4_;
  auVar143._8_4_ = fVar87 * auVar279._8_4_;
  fVar89 = auVar63._12_4_;
  auVar143._12_4_ = fVar89 * auVar279._12_4_;
  auVar92._0_4_ = auVar12._0_4_ * fVar59;
  auVar92._4_4_ = auVar12._4_4_ * fVar85;
  auVar92._8_4_ = auVar12._8_4_ * fVar87;
  auVar92._12_4_ = auVar12._12_4_ * fVar89;
  auVar63._0_4_ = auVar111._0_4_ * fVar59;
  auVar63._4_4_ = auVar111._4_4_ * fVar85;
  auVar63._8_4_ = auVar111._8_4_ * fVar87;
  auVar63._12_4_ = auVar111._12_4_ * fVar89;
  auVar8 = vfmadd231ps_fma(auVar143,auVar93,auVar8);
  auVar279 = vfmadd231ps_fma(auVar92,auVar93,auVar11);
  auVar11 = vfmadd231ps_fma(auVar63,auVar93,auVar64);
  auVar12 = vfmadd231ps_fma(auVar8,auVar270,auVar7);
  auVar64 = vfmadd231ps_fma(auVar279,auVar270,auVar10);
  auVar111 = vfmadd231ps_fma(auVar11,auVar270,auVar65);
  auVar244._8_4_ = 0x7fffffff;
  auVar244._0_8_ = 0x7fffffff7fffffff;
  auVar244._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar121,auVar244);
  auVar248._8_4_ = 0x219392ef;
  auVar248._0_8_ = 0x219392ef219392ef;
  auVar248._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar248,1);
  auVar8 = vblendvps_avx(auVar121,auVar248,auVar7);
  auVar7 = vandps_avx(auVar94,auVar244);
  auVar7 = vcmpps_avx(auVar7,auVar248,1);
  auVar279 = vblendvps_avx(auVar94,auVar248,auVar7);
  auVar7 = vandps_avx(auVar134,auVar244);
  auVar7 = vcmpps_avx(auVar7,auVar248,1);
  auVar7 = vblendvps_avx(auVar134,auVar248,auVar7);
  auVar10 = vrcpps_avx(auVar8);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar10,auVar179);
  auVar10 = vfmadd132ps_fma(auVar8,auVar10,auVar10);
  auVar8 = vrcpps_avx(auVar279);
  auVar279 = vfnmadd213ps_fma(auVar279,auVar8,auVar179);
  auVar11 = vfmadd132ps_fma(auVar279,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar8,auVar179);
  auVar65 = vfmadd132ps_fma(auVar7,auVar8,auVar8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar56 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar134._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar134._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar134._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar134._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar56 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar144._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar144._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar144._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar144._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar94._1_3_ = 0;
  auVar94[0] = PVar2;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar279);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar56 * -2 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar64);
  auVar196._0_4_ = auVar7._0_4_ * auVar11._0_4_;
  auVar196._4_4_ = auVar7._4_4_ * auVar11._4_4_;
  auVar196._8_4_ = auVar7._8_4_ * auVar11._8_4_;
  auVar196._12_4_ = auVar7._12_4_ * auVar11._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar8);
  auVar7 = vsubps_avx(auVar7,auVar64);
  auVar93._0_4_ = auVar11._0_4_ * auVar7._0_4_;
  auVar93._4_4_ = auVar11._4_4_ * auVar7._4_4_;
  auVar93._8_4_ = auVar11._8_4_ * auVar7._8_4_;
  auVar93._12_4_ = auVar11._12_4_ * auVar7._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar49 + uVar56 + 6);
  auVar7 = vpmovsxwd_avx(auVar11);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar111);
  auVar121._0_4_ = auVar65._0_4_ * auVar7._0_4_;
  auVar121._4_4_ = auVar65._4_4_ * auVar7._4_4_;
  auVar121._8_4_ = auVar65._8_4_ * auVar7._8_4_;
  auVar121._12_4_ = auVar65._12_4_ * auVar7._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar56 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar12);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar111);
  auVar64._0_4_ = auVar65._0_4_ * auVar7._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar7._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar7._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar134,auVar144);
  auVar8 = vpminsd_avx(auVar196,auVar93);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vpminsd_avx(auVar121,auVar64);
  uVar60 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar208._4_4_ = uVar60;
  auVar208._0_4_ = uVar60;
  auVar208._8_4_ = uVar60;
  auVar208._12_4_ = uVar60;
  auVar8 = vmaxps_avx(auVar8,auVar208);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  local_420._0_4_ = auVar7._0_4_ * 0.99999964;
  local_420._4_4_ = auVar7._4_4_ * 0.99999964;
  local_420._8_4_ = auVar7._8_4_ * 0.99999964;
  local_420._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar134,auVar144);
  auVar8 = vpmaxsd_avx(auVar196,auVar93);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar8 = vpmaxsd_avx(auVar121,auVar64);
  uVar60 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar111._4_4_ = uVar60;
  auVar111._0_4_ = uVar60;
  auVar111._8_4_ = uVar60;
  auVar111._12_4_ = uVar60;
  auVar8 = vminps_avx(auVar8,auVar111);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar65._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar94[4] = PVar2;
  auVar94._5_3_ = 0;
  auVar94[8] = PVar2;
  auVar94._9_3_ = 0;
  auVar94[0xc] = PVar2;
  auVar94._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar94,_DAT_01f7fcf0);
  auVar7 = vcmpps_avx(local_420,auVar65,2);
  auVar7 = vandps_avx(auVar7,auVar8);
  uVar47 = vmovmskps_avx(auVar7);
  if (uVar47 == 0) {
    return false;
  }
  uVar47 = uVar47 & 0xff;
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  iVar48 = 1 << ((uint)k & 0x1f);
  auVar82._4_4_ = iVar48;
  auVar82._0_4_ = iVar48;
  auVar82._8_4_ = iVar48;
  auVar82._12_4_ = iVar48;
  auVar82._16_4_ = iVar48;
  auVar82._20_4_ = iVar48;
  auVar82._24_4_ = iVar48;
  auVar82._28_4_ = iVar48;
  auVar14 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar81 = vpand_avx2(auVar82,auVar14);
  local_300 = vpcmpeqd_avx2(auVar81,auVar14);
LAB_015ad465:
  lVar52 = 0;
  uVar56 = (ulong)uVar47;
  for (uVar49 = uVar56; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
    lVar52 = lVar52 + 1;
  }
  uVar47 = *(uint *)(prim + 2);
  local_2e0 = *(uint *)(prim + lVar52 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar47].ptr;
  uVar49 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_2e0);
  p_Var4 = pGVar3[1].intersectionFilterN;
  pvVar5 = pGVar3[2].userPtr;
  _Var6 = pGVar3[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar7 = *(undefined1 (*) [16])(_Var6 + uVar49 * (long)pvVar5);
  auVar8 = *(undefined1 (*) [16])(_Var6 + (uVar49 + 1) * (long)pvVar5);
  auVar279 = *(undefined1 (*) [16])(_Var6 + (uVar49 + 2) * (long)pvVar5);
  auVar10 = *(undefined1 (*) [16])(_Var6 + (long)pvVar5 * (uVar49 + 3));
  lVar52 = *(long *)&pGVar3[1].time_range.upper;
  auVar11 = *(undefined1 (*) [16])(lVar52 + (long)p_Var4 * uVar49);
  auVar12 = *(undefined1 (*) [16])(lVar52 + (long)p_Var4 * (uVar49 + 1));
  auVar65 = *(undefined1 (*) [16])(lVar52 + (long)p_Var4 * (uVar49 + 2));
  uVar56 = uVar56 - 1 & uVar56;
  auVar64 = *(undefined1 (*) [16])(lVar52 + (long)p_Var4 * (uVar49 + 3));
  if (uVar56 != 0) {
    uVar57 = uVar56 - 1 & uVar56;
    for (uVar49 = uVar56; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
    }
    if (uVar57 != 0) {
      for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar134 = ZEXT816(0) << 0x40;
  auVar95._0_4_ = auVar64._0_4_ * 0.0;
  auVar95._4_4_ = auVar64._4_4_ * 0.0;
  auVar95._8_4_ = auVar64._8_4_ * 0.0;
  auVar95._12_4_ = auVar64._12_4_ * 0.0;
  auVar63 = vfmadd231ps_fma(auVar95,auVar65,auVar134);
  auVar93 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar12,auVar63);
  local_710._0_4_ = auVar11._0_4_ + auVar93._0_4_;
  local_710._4_4_ = auVar11._4_4_ + auVar93._4_4_;
  fStack_708 = auVar11._8_4_ + auVar93._8_4_;
  fStack_704 = auVar11._12_4_ + auVar93._12_4_;
  auVar271._8_4_ = 0x40400000;
  auVar271._0_8_ = 0x4040000040400000;
  auVar271._12_4_ = 0x40400000;
  auVar93 = vfmadd231ps_fma(auVar63,auVar12,auVar271);
  auVar94 = vfnmadd231ps_fma(auVar93,auVar11,auVar271);
  auVar245._0_4_ = auVar10._0_4_ * 0.0;
  auVar245._4_4_ = auVar10._4_4_ * 0.0;
  auVar245._8_4_ = auVar10._8_4_ * 0.0;
  auVar245._12_4_ = auVar10._12_4_ * 0.0;
  auVar63 = vfmadd231ps_fma(auVar245,auVar279,auVar134);
  auVar93 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar8,auVar63);
  auVar260._0_4_ = auVar7._0_4_ + auVar93._0_4_;
  auVar260._4_4_ = auVar7._4_4_ + auVar93._4_4_;
  auVar260._8_4_ = auVar7._8_4_ + auVar93._8_4_;
  auVar260._12_4_ = auVar7._12_4_ + auVar93._12_4_;
  auVar93 = vfmadd231ps_fma(auVar63,auVar8,auVar271);
  auVar63 = vfnmadd231ps_fma(auVar93,auVar7,auVar271);
  auVar93 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar65,auVar64);
  auVar93 = vfmadd231ps_fma(auVar93,auVar12,auVar134);
  auVar93 = vfmadd231ps_fma(auVar93,auVar11,auVar134);
  auVar135._0_4_ = auVar64._0_4_ * 3.0;
  auVar135._4_4_ = auVar64._4_4_ * 3.0;
  auVar135._8_4_ = auVar64._8_4_ * 3.0;
  auVar135._12_4_ = auVar64._12_4_ * 3.0;
  auVar65 = vfnmadd231ps_fma(auVar135,auVar271,auVar65);
  auVar12 = vfmadd231ps_fma(auVar65,auVar134,auVar12);
  auVar121 = vfnmadd231ps_fma(auVar12,auVar134,auVar11);
  auVar11 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar279,auVar10);
  auVar11 = vfmadd231ps_fma(auVar11,auVar8,auVar134);
  auVar11 = vfmadd231ps_fma(auVar11,auVar7,auVar134);
  auVar223._0_4_ = auVar10._0_4_ * 3.0;
  auVar223._4_4_ = auVar10._4_4_ * 3.0;
  auVar223._8_4_ = auVar10._8_4_ * 3.0;
  auVar223._12_4_ = auVar10._12_4_ * 3.0;
  auVar279 = vfnmadd231ps_fma(auVar223,auVar271,auVar279);
  auVar8 = vfmadd231ps_fma(auVar279,auVar134,auVar8);
  auVar12 = vfnmadd231ps_fma(auVar8,auVar134,auVar7);
  auVar7 = vshufps_avx(auVar94,auVar94,0xc9);
  auVar8 = vshufps_avx(auVar260,auVar260,0xc9);
  fVar120 = auVar94._0_4_;
  auVar160._0_4_ = fVar120 * auVar8._0_4_;
  fVar86 = auVar94._4_4_;
  auVar160._4_4_ = fVar86 * auVar8._4_4_;
  fVar88 = auVar94._8_4_;
  auVar160._8_4_ = fVar88 * auVar8._8_4_;
  fVar159 = auVar94._12_4_;
  auVar160._12_4_ = fVar159 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar160,auVar7,auVar260);
  auVar279 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar161._0_4_ = fVar120 * auVar8._0_4_;
  auVar161._4_4_ = fVar86 * auVar8._4_4_;
  auVar161._8_4_ = fVar88 * auVar8._8_4_;
  auVar161._12_4_ = fVar159 * auVar8._12_4_;
  auVar7 = vfmsub231ps_fma(auVar161,auVar7,auVar63);
  auVar10 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar8 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar61 = auVar121._0_4_;
  auVar145._0_4_ = fVar61 * auVar8._0_4_;
  fVar222 = auVar121._4_4_;
  auVar145._4_4_ = fVar222 * auVar8._4_4_;
  fVar133 = auVar121._8_4_;
  auVar145._8_4_ = fVar133 * auVar8._8_4_;
  fVar142 = auVar121._12_4_;
  auVar145._12_4_ = fVar142 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar145,auVar7,auVar11);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar180._0_4_ = fVar61 * auVar8._0_4_;
  auVar180._4_4_ = fVar222 * auVar8._4_4_;
  auVar180._8_4_ = fVar133 * auVar8._8_4_;
  auVar180._12_4_ = fVar142 * auVar8._12_4_;
  auVar7 = vfmsub231ps_fma(auVar180,auVar7,auVar12);
  auVar12 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vdpps_avx(auVar279,auVar279,0x7f);
  fVar85 = auVar7._0_4_;
  auVar224._4_12_ = ZEXT812(0) << 0x20;
  auVar224._0_4_ = fVar85;
  auVar8 = vrsqrtss_avx(auVar224,auVar224);
  fVar59 = auVar8._0_4_;
  fVar87 = fVar59 * 1.5 - fVar85 * 0.5 * fVar59 * fVar59 * fVar59;
  auVar8 = vdpps_avx(auVar279,auVar10,0x7f);
  fVar158 = auVar279._0_4_ * fVar87;
  fVar176 = auVar279._4_4_ * fVar87;
  fVar177 = auVar279._8_4_ * fVar87;
  fVar178 = auVar279._12_4_ * fVar87;
  auVar238._0_4_ = auVar10._0_4_ * fVar85;
  auVar238._4_4_ = auVar10._4_4_ * fVar85;
  auVar238._8_4_ = auVar10._8_4_ * fVar85;
  auVar238._12_4_ = auVar10._12_4_ * fVar85;
  fVar59 = auVar8._0_4_;
  auVar197._0_4_ = auVar279._0_4_ * fVar59;
  auVar197._4_4_ = auVar279._4_4_ * fVar59;
  auVar197._8_4_ = auVar279._8_4_ * fVar59;
  auVar197._12_4_ = auVar279._12_4_ * fVar59;
  auVar279 = vsubps_avx(auVar238,auVar197);
  auVar8 = vrcpss_avx(auVar224,auVar224);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar59 = auVar8._0_4_ * auVar7._0_4_;
  auVar7 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar85 = auVar7._0_4_;
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = fVar85;
  auVar8 = vrsqrtss_avx(auVar225,auVar225);
  fVar89 = auVar8._0_4_;
  auVar8 = vdpps_avx(auVar11,auVar12,0x7f);
  fVar89 = fVar89 * 1.5 - fVar85 * 0.5 * fVar89 * fVar89 * fVar89;
  fVar243 = fVar89 * auVar11._0_4_;
  fVar257 = fVar89 * auVar11._4_4_;
  fVar258 = fVar89 * auVar11._8_4_;
  fVar259 = fVar89 * auVar11._12_4_;
  auVar181._0_4_ = fVar85 * auVar12._0_4_;
  auVar181._4_4_ = fVar85 * auVar12._4_4_;
  auVar181._8_4_ = fVar85 * auVar12._8_4_;
  auVar181._12_4_ = fVar85 * auVar12._12_4_;
  fVar85 = auVar8._0_4_;
  auVar146._0_4_ = fVar85 * auVar11._0_4_;
  auVar146._4_4_ = fVar85 * auVar11._4_4_;
  auVar146._8_4_ = fVar85 * auVar11._8_4_;
  auVar146._12_4_ = fVar85 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar181,auVar146);
  auVar8 = vrcpss_avx(auVar225,auVar225);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,ZEXT416(0x40000000));
  fVar85 = auVar7._0_4_ * auVar8._0_4_;
  auVar7 = vshufps_avx(_local_710,_local_710,0xff);
  auVar209._0_4_ = auVar7._0_4_ * fVar158;
  auVar209._4_4_ = auVar7._4_4_ * fVar176;
  auVar209._8_4_ = auVar7._8_4_ * fVar177;
  auVar209._12_4_ = auVar7._12_4_ * fVar178;
  auVar65 = vsubps_avx(_local_710,auVar209);
  auVar8 = vshufps_avx(auVar94,auVar94,0xff);
  auVar162._0_4_ = auVar8._0_4_ * fVar158 + fVar87 * auVar279._0_4_ * fVar59 * auVar7._0_4_;
  auVar162._4_4_ = auVar8._4_4_ * fVar176 + fVar87 * auVar279._4_4_ * fVar59 * auVar7._4_4_;
  auVar162._8_4_ = auVar8._8_4_ * fVar177 + fVar87 * auVar279._8_4_ * fVar59 * auVar7._8_4_;
  auVar162._12_4_ = auVar8._12_4_ * fVar178 + fVar87 * auVar279._12_4_ * fVar59 * auVar7._12_4_;
  auVar279 = vsubps_avx(auVar94,auVar162);
  auVar226._0_4_ = auVar209._0_4_ + (float)local_710._0_4_;
  auVar226._4_4_ = auVar209._4_4_ + (float)local_710._4_4_;
  auVar226._8_4_ = auVar209._8_4_ + fStack_708;
  auVar226._12_4_ = auVar209._12_4_ + fStack_704;
  auVar7 = vshufps_avx(auVar93,auVar93,0xff);
  auVar112._0_4_ = fVar243 * auVar7._0_4_;
  auVar112._4_4_ = fVar257 * auVar7._4_4_;
  auVar112._8_4_ = fVar258 * auVar7._8_4_;
  auVar112._12_4_ = fVar259 * auVar7._12_4_;
  auVar64 = vsubps_avx(auVar93,auVar112);
  auVar8 = vshufps_avx(auVar121,auVar121,0xff);
  auVar96._0_4_ = fVar243 * auVar8._0_4_ + auVar7._0_4_ * fVar89 * auVar10._0_4_ * fVar85;
  auVar96._4_4_ = fVar257 * auVar8._4_4_ + auVar7._4_4_ * fVar89 * auVar10._4_4_ * fVar85;
  auVar96._8_4_ = fVar258 * auVar8._8_4_ + auVar7._8_4_ * fVar89 * auVar10._8_4_ * fVar85;
  auVar96._12_4_ = fVar259 * auVar8._12_4_ + auVar7._12_4_ * fVar89 * auVar10._12_4_ * fVar85;
  auVar7 = vsubps_avx(auVar121,auVar96);
  fVar158 = auVar93._0_4_ + auVar112._0_4_;
  fVar176 = auVar93._4_4_ + auVar112._4_4_;
  fVar177 = auVar93._8_4_ + auVar112._8_4_;
  fVar178 = auVar93._12_4_ + auVar112._12_4_;
  auVar122._0_4_ = auVar65._0_4_ + auVar279._0_4_ * 0.33333334;
  auVar122._4_4_ = auVar65._4_4_ + auVar279._4_4_ * 0.33333334;
  auVar122._8_4_ = auVar65._8_4_ + auVar279._8_4_ * 0.33333334;
  auVar122._12_4_ = auVar65._12_4_ + auVar279._12_4_ * 0.33333334;
  auVar97._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar97._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar97._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar97._12_4_ = auVar7._12_4_ * 0.33333334;
  auVar93 = vsubps_avx(auVar64,auVar97);
  auVar63 = vsubps_avx(auVar65,auVar111);
  auVar7 = vshufps_avx(auVar63,auVar63,0x55);
  auVar8 = vshufps_avx(auVar63,auVar63,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar59 = pre->ray_space[k].vz.field_0.m128[0];
  fVar85 = pre->ray_space[k].vz.field_0.m128[1];
  fVar87 = pre->ray_space[k].vz.field_0.m128[2];
  fVar89 = pre->ray_space[k].vz.field_0.m128[3];
  auVar98._0_4_ = fVar59 * auVar8._0_4_;
  auVar98._4_4_ = fVar85 * auVar8._4_4_;
  auVar98._8_4_ = fVar87 * auVar8._8_4_;
  auVar98._12_4_ = fVar89 * auVar8._12_4_;
  auVar279 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar1,auVar7);
  auVar94 = vsubps_avx(auVar122,auVar111);
  auVar7 = vshufps_avx(auVar94,auVar94,0x55);
  auVar8 = vshufps_avx(auVar94,auVar94,0xaa);
  auVar277._0_4_ = fVar59 * auVar8._0_4_;
  auVar277._4_4_ = fVar85 * auVar8._4_4_;
  auVar277._8_4_ = fVar87 * auVar8._8_4_;
  auVar277._12_4_ = fVar89 * auVar8._12_4_;
  auVar8 = vfmadd231ps_fma(auVar277,(undefined1  [16])aVar1,auVar7);
  local_3b0 = vsubps_avx(auVar93,auVar111);
  auVar7 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar246._0_4_ = fVar59 * auVar7._0_4_;
  auVar246._4_4_ = fVar85 * auVar7._4_4_;
  auVar246._8_4_ = fVar87 * auVar7._8_4_;
  auVar246._12_4_ = fVar89 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_3b0,local_3b0,0x55);
  auVar10 = vfmadd231ps_fma(auVar246,(undefined1  [16])aVar1,auVar7);
  local_3c0 = vsubps_avx(auVar64,auVar111);
  auVar7 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar261._0_4_ = fVar59 * auVar7._0_4_;
  auVar261._4_4_ = fVar85 * auVar7._4_4_;
  auVar261._8_4_ = fVar87 * auVar7._8_4_;
  auVar261._12_4_ = fVar89 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_3c0,local_3c0,0x55);
  auVar11 = vfmadd231ps_fma(auVar261,(undefined1  [16])aVar1,auVar7);
  local_3d0 = vsubps_avx(auVar226,auVar111);
  auVar7 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar147._0_4_ = fVar59 * auVar7._0_4_;
  auVar147._4_4_ = fVar85 * auVar7._4_4_;
  auVar147._8_4_ = fVar87 * auVar7._8_4_;
  auVar147._12_4_ = fVar89 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_3d0,local_3d0,0x55);
  auVar12 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar1,auVar7);
  auVar66._0_4_ = (fVar120 + auVar162._0_4_) * 0.33333334 + auVar226._0_4_;
  auVar66._4_4_ = (fVar86 + auVar162._4_4_) * 0.33333334 + auVar226._4_4_;
  auVar66._8_4_ = (fVar88 + auVar162._8_4_) * 0.33333334 + auVar226._8_4_;
  auVar66._12_4_ = (fVar159 + auVar162._12_4_) * 0.33333334 + auVar226._12_4_;
  local_3e0 = vsubps_avx(auVar66,auVar111);
  auVar7 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar198._0_4_ = auVar7._0_4_ * fVar59;
  auVar198._4_4_ = auVar7._4_4_ * fVar85;
  auVar198._8_4_ = auVar7._8_4_ * fVar87;
  auVar198._12_4_ = auVar7._12_4_ * fVar89;
  auVar7 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar134 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar1,auVar7);
  auVar210._0_4_ = (fVar61 + auVar96._0_4_) * 0.33333334;
  auVar210._4_4_ = (fVar222 + auVar96._4_4_) * 0.33333334;
  auVar210._8_4_ = (fVar133 + auVar96._8_4_) * 0.33333334;
  auVar210._12_4_ = (fVar142 + auVar96._12_4_) * 0.33333334;
  auVar19._4_4_ = fVar176;
  auVar19._0_4_ = fVar158;
  auVar19._8_4_ = fVar177;
  auVar19._12_4_ = fVar178;
  auVar121 = vsubps_avx(auVar19,auVar210);
  local_3f0 = vsubps_avx(auVar121,auVar111);
  auVar7 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar211._0_4_ = auVar7._0_4_ * fVar59;
  auVar211._4_4_ = auVar7._4_4_ * fVar85;
  auVar211._8_4_ = auVar7._8_4_ * fVar87;
  auVar211._12_4_ = auVar7._12_4_ * fVar89;
  auVar7 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar62 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar1,auVar7);
  local_400 = vsubps_avx(auVar19,auVar111);
  auVar7 = vshufps_avx(local_400,local_400,0xaa);
  auVar67._0_4_ = fVar59 * auVar7._0_4_;
  auVar67._4_4_ = fVar85 * auVar7._4_4_;
  auVar67._8_4_ = fVar87 * auVar7._8_4_;
  auVar67._12_4_ = fVar89 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_400,local_400,0x55);
  auVar7 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar1,auVar7);
  local_520 = auVar63._0_4_;
  auVar163._4_4_ = local_520;
  auVar163._0_4_ = local_520;
  auVar163._8_4_ = local_520;
  auVar163._12_4_ = local_520;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar111 = vfmadd231ps_fma(auVar279,(undefined1  [16])aVar1,auVar163);
  local_530 = auVar94._0_4_;
  auVar164._4_4_ = local_530;
  auVar164._0_4_ = local_530;
  auVar164._8_4_ = local_530;
  auVar164._12_4_ = local_530;
  auVar92 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar164);
  uVar60 = local_3b0._0_4_;
  auVar165._4_4_ = uVar60;
  auVar165._0_4_ = uVar60;
  auVar165._8_4_ = uVar60;
  auVar165._12_4_ = uVar60;
  auVar248 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar165);
  uVar60 = local_3c0._0_4_;
  auVar166._4_4_ = uVar60;
  auVar166._0_4_ = uVar60;
  auVar166._8_4_ = uVar60;
  auVar166._12_4_ = uVar60;
  auVar73 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar166);
  uVar60 = local_3d0._0_4_;
  auVar167._4_4_ = uVar60;
  auVar167._0_4_ = uVar60;
  auVar167._8_4_ = uVar60;
  auVar167._12_4_ = uVar60;
  auVar143 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar1,auVar167);
  uVar60 = local_3e0._0_4_;
  auVar168._4_4_ = uVar60;
  auVar168._0_4_ = uVar60;
  auVar168._8_4_ = uVar60;
  auVar168._12_4_ = uVar60;
  auVar134 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar1,auVar168);
  uVar60 = local_3f0._0_4_;
  auVar169._4_4_ = uVar60;
  auVar169._0_4_ = uVar60;
  auVar169._8_4_ = uVar60;
  auVar169._12_4_ = uVar60;
  auVar62 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar169);
  uVar60 = local_400._0_4_;
  auVar170._4_4_ = uVar60;
  auVar170._0_4_ = uVar60;
  auVar170._8_4_ = uVar60;
  auVar170._12_4_ = uVar60;
  auVar144 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar1,auVar170);
  auVar10 = vmovlhps_avx(auVar111,auVar143);
  auVar11 = vmovlhps_avx(auVar92,auVar134);
  auVar12 = vmovlhps_avx(auVar248,auVar62);
  _local_3a0 = vmovlhps_avx(auVar73,auVar144);
  auVar7 = vminps_avx(auVar10,auVar11);
  auVar8 = vminps_avx(auVar12,_local_3a0);
  auVar279 = vminps_avx(auVar7,auVar8);
  auVar7 = vmaxps_avx(auVar10,auVar11);
  auVar8 = vmaxps_avx(auVar12,_local_3a0);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vshufpd_avx(auVar279,auVar279,3);
  auVar279 = vminps_avx(auVar279,auVar8);
  auVar8 = vshufpd_avx(auVar7,auVar7,3);
  auVar8 = vmaxps_avx(auVar7,auVar8);
  auVar7 = vandps_avx(auVar244,auVar279);
  auVar8 = vandps_avx(auVar244,auVar8);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vmovshdup_avx(auVar7);
  auVar7 = vmaxss_avx(auVar8,auVar7);
  fVar85 = auVar7._0_4_ * 9.536743e-07;
  auVar182._8_8_ = auVar111._0_8_;
  auVar182._0_8_ = auVar111._0_8_;
  auVar227._8_8_ = auVar92._0_8_;
  auVar227._0_8_ = auVar92._0_8_;
  auVar247._0_8_ = auVar248._0_8_;
  auVar247._8_8_ = auVar247._0_8_;
  auVar262._0_8_ = auVar73._0_8_;
  auVar262._8_8_ = auVar262._0_8_;
  local_360 = -fVar85;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  local_2c0 = uVar47;
  uStack_2bc = uVar47;
  uStack_2b8 = uVar47;
  uStack_2b4 = uVar47;
  uStack_2b0 = uVar47;
  uStack_2ac = uVar47;
  uStack_2a8 = uVar47;
  uStack_2a4 = uVar47;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  bVar58 = false;
  uVar49 = 0;
  fVar59 = *(float *)(ray + k * 4 + 0x60);
  local_370 = vsubps_avx(auVar11,auVar10);
  local_380 = vsubps_avx(auVar12,auVar11);
  local_390 = vsubps_avx(_local_3a0,auVar12);
  local_430 = vsubps_avx(auVar226,auVar65);
  local_440 = vsubps_avx(auVar66,auVar122);
  local_450 = vsubps_avx(auVar121,auVar93);
  auVar228._4_4_ = fVar176;
  auVar228._0_4_ = fVar158;
  auVar228._8_4_ = fVar177;
  auVar228._12_4_ = fVar178;
  _local_460 = vsubps_avx(auVar228,auVar64);
  auVar68 = ZEXT816(0x3f80000000000000);
  local_340 = fVar85;
  fStack_33c = fVar85;
  fStack_338 = fVar85;
  fStack_334 = fVar85;
  fStack_330 = fVar85;
  fStack_32c = fVar85;
  fStack_328 = fVar85;
  fStack_324 = fVar85;
  local_410 = auVar68;
LAB_015adc2e:
  auVar7 = vshufps_avx(auVar68,auVar68,0x50);
  auVar278._8_4_ = 0x3f800000;
  auVar278._0_8_ = 0x3f8000003f800000;
  auVar278._12_4_ = 0x3f800000;
  auVar282._16_4_ = 0x3f800000;
  auVar282._0_16_ = auVar278;
  auVar282._20_4_ = 0x3f800000;
  auVar282._24_4_ = 0x3f800000;
  auVar282._28_4_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar278,auVar7);
  fVar87 = auVar7._0_4_;
  fVar133 = auVar143._0_4_;
  auVar69._0_4_ = fVar133 * fVar87;
  fVar89 = auVar7._4_4_;
  fVar142 = auVar143._4_4_;
  auVar69._4_4_ = fVar142 * fVar89;
  fVar120 = auVar7._8_4_;
  auVar69._8_4_ = fVar133 * fVar120;
  fVar86 = auVar7._12_4_;
  auVar69._12_4_ = fVar142 * fVar86;
  fVar243 = auVar134._0_4_;
  auVar171._0_4_ = fVar243 * fVar87;
  fVar257 = auVar134._4_4_;
  auVar171._4_4_ = fVar257 * fVar89;
  auVar171._8_4_ = fVar243 * fVar120;
  auVar171._12_4_ = fVar257 * fVar86;
  fVar195 = auVar62._0_4_;
  auVar136._0_4_ = fVar195 * fVar87;
  fVar206 = auVar62._4_4_;
  auVar136._4_4_ = fVar206 * fVar89;
  auVar136._8_4_ = fVar195 * fVar120;
  auVar136._12_4_ = fVar206 * fVar86;
  fVar207 = auVar144._0_4_;
  auVar113._0_4_ = fVar207 * fVar87;
  fVar221 = auVar144._4_4_;
  auVar113._4_4_ = fVar221 * fVar89;
  auVar113._8_4_ = fVar207 * fVar120;
  auVar113._12_4_ = fVar221 * fVar86;
  auVar92 = vfmadd231ps_fma(auVar69,auVar8,auVar182);
  auVar248 = vfmadd231ps_fma(auVar171,auVar8,auVar227);
  auVar73 = vfmadd231ps_fma(auVar136,auVar8,auVar247);
  auVar179 = vfmadd231ps_fma(auVar113,auVar262,auVar8);
  auVar7 = vmovshdup_avx(local_410);
  fVar87 = local_410._0_4_;
  fStack_228 = (auVar7._0_4_ - fVar87) * 0.04761905;
  auVar219._4_4_ = fVar87;
  auVar219._0_4_ = fVar87;
  auVar219._8_4_ = fVar87;
  auVar219._12_4_ = fVar87;
  auVar219._16_4_ = fVar87;
  auVar219._20_4_ = fVar87;
  auVar219._24_4_ = fVar87;
  auVar219._28_4_ = fVar87;
  auVar106._0_8_ = auVar7._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  auVar81 = vsubps_avx(auVar106,auVar219);
  uVar60 = auVar92._0_4_;
  auVar275._4_4_ = uVar60;
  auVar275._0_4_ = uVar60;
  auVar275._8_4_ = uVar60;
  auVar275._12_4_ = uVar60;
  auVar275._16_4_ = uVar60;
  auVar275._20_4_ = uVar60;
  auVar275._24_4_ = uVar60;
  auVar275._28_4_ = uVar60;
  auVar7 = vmovshdup_avx(auVar92);
  uVar91 = auVar7._0_8_;
  auVar268._8_8_ = uVar91;
  auVar268._0_8_ = uVar91;
  auVar268._16_8_ = uVar91;
  auVar268._24_8_ = uVar91;
  fVar258 = auVar248._0_4_;
  auVar254._4_4_ = fVar258;
  auVar254._0_4_ = fVar258;
  auVar254._8_4_ = fVar258;
  auVar254._12_4_ = fVar258;
  auVar254._16_4_ = fVar258;
  auVar254._20_4_ = fVar258;
  auVar254._24_4_ = fVar258;
  auVar254._28_4_ = fVar258;
  auVar8 = vmovshdup_avx(auVar248);
  auVar107._0_8_ = auVar8._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  fVar222 = auVar73._0_4_;
  auVar187._4_4_ = fVar222;
  auVar187._0_4_ = fVar222;
  auVar187._8_4_ = fVar222;
  auVar187._12_4_ = fVar222;
  auVar187._16_4_ = fVar222;
  auVar187._20_4_ = fVar222;
  auVar187._24_4_ = fVar222;
  auVar187._28_4_ = fVar222;
  auVar279 = vmovshdup_avx(auVar73);
  auVar204._0_8_ = auVar279._0_8_;
  auVar204._8_8_ = auVar204._0_8_;
  auVar204._16_8_ = auVar204._0_8_;
  auVar204._24_8_ = auVar204._0_8_;
  fVar61 = auVar179._0_4_;
  auVar111 = vmovshdup_avx(auVar179);
  auVar239 = vfmadd132ps_fma(auVar81,auVar219,_DAT_01faff20);
  auVar81 = vsubps_avx(auVar282,ZEXT1632(auVar239));
  fVar87 = auVar239._0_4_;
  fVar89 = auVar239._4_4_;
  auVar14._4_4_ = fVar258 * fVar89;
  auVar14._0_4_ = fVar258 * fVar87;
  fVar120 = auVar239._8_4_;
  auVar14._8_4_ = fVar258 * fVar120;
  fVar86 = auVar239._12_4_;
  auVar14._12_4_ = fVar258 * fVar86;
  auVar14._16_4_ = fVar258 * 0.0;
  auVar14._20_4_ = fVar258 * 0.0;
  auVar14._24_4_ = fVar258 * 0.0;
  auVar14._28_4_ = 0x3f800000;
  auVar239 = vfmadd231ps_fma(auVar14,auVar81,auVar275);
  fVar88 = auVar8._0_4_;
  fVar159 = auVar8._4_4_;
  auVar13._4_4_ = fVar159 * fVar89;
  auVar13._0_4_ = fVar88 * fVar87;
  auVar13._8_4_ = fVar88 * fVar120;
  auVar13._12_4_ = fVar159 * fVar86;
  auVar13._16_4_ = fVar88 * 0.0;
  auVar13._20_4_ = fVar159 * 0.0;
  auVar13._24_4_ = fVar88 * 0.0;
  auVar13._28_4_ = uVar60;
  auVar196 = vfmadd231ps_fma(auVar13,auVar81,auVar268);
  auVar9._4_4_ = fVar222 * fVar89;
  auVar9._0_4_ = fVar222 * fVar87;
  auVar9._8_4_ = fVar222 * fVar120;
  auVar9._12_4_ = fVar222 * fVar86;
  auVar9._16_4_ = fVar222 * 0.0;
  auVar9._20_4_ = fVar222 * 0.0;
  auVar9._24_4_ = fVar222 * 0.0;
  auVar9._28_4_ = auVar7._4_4_;
  auVar208 = vfmadd231ps_fma(auVar9,auVar81,auVar254);
  fVar88 = auVar279._0_4_;
  fVar159 = auVar279._4_4_;
  auVar15._4_4_ = fVar159 * fVar89;
  auVar15._0_4_ = fVar88 * fVar87;
  auVar15._8_4_ = fVar88 * fVar120;
  auVar15._12_4_ = fVar159 * fVar86;
  auVar15._16_4_ = fVar88 * 0.0;
  auVar15._20_4_ = fVar159 * 0.0;
  auVar15._24_4_ = fVar88 * 0.0;
  auVar15._28_4_ = fVar258;
  auVar124 = vfmadd231ps_fma(auVar15,auVar81,auVar107);
  auVar7 = vshufps_avx(auVar92,auVar92,0xaa);
  local_700._8_8_ = auVar7._0_8_;
  local_700._0_8_ = local_700._8_8_;
  local_700._16_8_ = local_700._8_8_;
  local_700._24_8_ = local_700._8_8_;
  auVar8 = vshufps_avx(auVar92,auVar92,0xff);
  uStack_778 = auVar8._0_8_;
  local_780 = (undefined1  [8])uStack_778;
  uStack_770 = uStack_778;
  uStack_768 = uStack_778;
  auVar16._4_4_ = fVar61 * fVar89;
  auVar16._0_4_ = fVar61 * fVar87;
  auVar16._8_4_ = fVar61 * fVar120;
  auVar16._12_4_ = fVar61 * fVar86;
  auVar16._16_4_ = fVar61 * 0.0;
  auVar16._20_4_ = fVar61 * 0.0;
  auVar16._24_4_ = fVar61 * 0.0;
  auVar16._28_4_ = fVar61;
  auVar92 = vfmadd231ps_fma(auVar16,auVar81,auVar187);
  auVar8 = vshufps_avx(auVar248,auVar248,0xaa);
  auVar188._0_8_ = auVar8._0_8_;
  auVar188._8_8_ = auVar188._0_8_;
  auVar188._16_8_ = auVar188._0_8_;
  auVar188._24_8_ = auVar188._0_8_;
  auVar279 = vshufps_avx(auVar248,auVar248,0xff);
  local_600._8_8_ = auVar279._0_8_;
  local_600._0_8_ = local_600._8_8_;
  local_600._16_8_ = local_600._8_8_;
  local_600._24_8_ = local_600._8_8_;
  fVar88 = auVar111._0_4_;
  fVar159 = auVar111._4_4_;
  auVar17._4_4_ = fVar159 * fVar89;
  auVar17._0_4_ = fVar88 * fVar87;
  auVar17._8_4_ = fVar88 * fVar120;
  auVar17._12_4_ = fVar159 * fVar86;
  auVar17._16_4_ = fVar88 * 0.0;
  auVar17._20_4_ = fVar159 * 0.0;
  auVar17._24_4_ = fVar88 * 0.0;
  auVar17._28_4_ = auVar7._4_4_;
  auVar237 = vfmadd231ps_fma(auVar17,auVar81,auVar204);
  auVar18._28_4_ = fVar159;
  auVar18._0_28_ =
       ZEXT1628(CONCAT412(auVar208._12_4_ * fVar86,
                          CONCAT48(auVar208._8_4_ * fVar120,
                                   CONCAT44(auVar208._4_4_ * fVar89,auVar208._0_4_ * fVar87))));
  auVar239 = vfmadd231ps_fma(auVar18,auVar81,ZEXT1632(auVar239));
  fVar88 = auVar279._4_4_;
  auVar256._28_4_ = fVar88;
  auVar256._0_28_ =
       ZEXT1628(CONCAT412(auVar124._12_4_ * fVar86,
                          CONCAT48(auVar124._8_4_ * fVar120,
                                   CONCAT44(auVar124._4_4_ * fVar89,auVar124._0_4_ * fVar87))));
  auVar196 = vfmadd231ps_fma(auVar256,auVar81,ZEXT1632(auVar196));
  auVar7 = vshufps_avx(auVar73,auVar73,0xaa);
  uVar91 = auVar7._0_8_;
  auVar175._8_8_ = uVar91;
  auVar175._0_8_ = uVar91;
  auVar175._16_8_ = uVar91;
  auVar175._24_8_ = uVar91;
  auVar111 = vshufps_avx(auVar73,auVar73,0xff);
  uVar91 = auVar111._0_8_;
  auVar283._8_8_ = uVar91;
  auVar283._0_8_ = uVar91;
  auVar283._16_8_ = uVar91;
  auVar283._24_8_ = uVar91;
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * fVar86,
                                               CONCAT48(auVar92._8_4_ * fVar120,
                                                        CONCAT44(auVar92._4_4_ * fVar89,
                                                                 auVar92._0_4_ * fVar87)))),auVar81,
                            ZEXT1632(auVar208));
  auVar92 = vshufps_avx(auVar179,auVar179,0xaa);
  auVar248 = vshufps_avx(auVar179,auVar179,0xff);
  auVar179 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar237._12_4_,
                                                CONCAT48(fVar120 * auVar237._8_4_,
                                                         CONCAT44(fVar89 * auVar237._4_4_,
                                                                  fVar87 * auVar237._0_4_)))),
                             auVar81,ZEXT1632(auVar124));
  auVar208 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar73._12_4_,
                                                CONCAT48(fVar120 * auVar73._8_4_,
                                                         CONCAT44(fVar89 * auVar73._4_4_,
                                                                  fVar87 * auVar73._0_4_)))),auVar81
                             ,ZEXT1632(auVar239));
  auVar14 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar239));
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar179._12_4_,
                                               CONCAT48(fVar120 * auVar179._8_4_,
                                                        CONCAT44(fVar89 * auVar179._4_4_,
                                                                 fVar87 * auVar179._0_4_)))),auVar81
                            ,ZEXT1632(auVar196));
  auVar82 = vsubps_avx(ZEXT1632(auVar179),ZEXT1632(auVar196));
  fStack_5c4 = auVar82._28_4_;
  auVar255._0_4_ = fStack_228 * auVar14._0_4_ * 3.0;
  auVar255._4_4_ = fStack_228 * auVar14._4_4_ * 3.0;
  auVar255._8_4_ = fStack_228 * auVar14._8_4_ * 3.0;
  auVar255._12_4_ = fStack_228 * auVar14._12_4_ * 3.0;
  auVar255._16_4_ = fStack_228 * auVar14._16_4_ * 3.0;
  auVar255._20_4_ = fStack_228 * auVar14._20_4_ * 3.0;
  auVar255._24_4_ = fStack_228 * auVar14._24_4_ * 3.0;
  auVar255._28_4_ = 0;
  local_5e0._0_4_ = fStack_228 * auVar82._0_4_ * 3.0;
  local_5e0._4_4_ = fStack_228 * auVar82._4_4_ * 3.0;
  fStack_5d8 = fStack_228 * auVar82._8_4_ * 3.0;
  fStack_5d4 = fStack_228 * auVar82._12_4_ * 3.0;
  fStack_5d0 = fStack_228 * auVar82._16_4_ * 3.0;
  fStack_5cc = fStack_228 * auVar82._20_4_ * 3.0;
  fStack_5c8 = fStack_228 * auVar82._24_4_ * 3.0;
  fVar159 = auVar8._0_4_;
  fVar61 = auVar8._4_4_;
  auVar20._4_4_ = fVar61 * fVar89;
  auVar20._0_4_ = fVar159 * fVar87;
  auVar20._8_4_ = fVar159 * fVar120;
  auVar20._12_4_ = fVar61 * fVar86;
  auVar20._16_4_ = fVar159 * 0.0;
  auVar20._20_4_ = fVar61 * 0.0;
  auVar20._24_4_ = fVar159 * 0.0;
  auVar20._28_4_ = fStack_5c4;
  auVar8 = vfmadd231ps_fma(auVar20,auVar81,local_700);
  fVar159 = auVar279._0_4_;
  auVar21._4_4_ = fVar88 * fVar89;
  auVar21._0_4_ = fVar159 * fVar87;
  auVar21._8_4_ = fVar159 * fVar120;
  auVar21._12_4_ = fVar88 * fVar86;
  auVar21._16_4_ = fVar159 * 0.0;
  auVar21._20_4_ = fVar88 * 0.0;
  auVar21._24_4_ = fVar159 * 0.0;
  auVar21._28_4_ = 0;
  auVar279 = vfmadd231ps_fma(auVar21,auVar81,_local_780);
  fVar88 = auVar7._0_4_;
  fVar159 = auVar7._4_4_;
  auVar22._4_4_ = fVar159 * fVar89;
  auVar22._0_4_ = fVar88 * fVar87;
  auVar22._8_4_ = fVar88 * fVar120;
  auVar22._12_4_ = fVar159 * fVar86;
  auVar22._16_4_ = fVar88 * 0.0;
  auVar22._20_4_ = fVar159 * 0.0;
  auVar22._24_4_ = fVar88 * 0.0;
  auVar22._28_4_ = auVar14._28_4_;
  auVar7 = vfmadd231ps_fma(auVar22,auVar81,auVar188);
  fVar88 = auVar111._0_4_;
  fVar222 = auVar111._4_4_;
  auVar23._4_4_ = fVar222 * fVar89;
  auVar23._0_4_ = fVar88 * fVar87;
  auVar23._8_4_ = fVar88 * fVar120;
  auVar23._12_4_ = fVar222 * fVar86;
  auVar23._16_4_ = fVar88 * 0.0;
  auVar23._20_4_ = fVar222 * 0.0;
  auVar23._24_4_ = fVar88 * 0.0;
  auVar23._28_4_ = fVar61;
  auVar111 = vfmadd231ps_fma(auVar23,auVar81,local_600);
  auVar15 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar208));
  fVar88 = auVar92._0_4_;
  fVar159 = auVar92._4_4_;
  auVar24._4_4_ = fVar159 * fVar89;
  auVar24._0_4_ = fVar88 * fVar87;
  auVar24._8_4_ = fVar88 * fVar120;
  auVar24._12_4_ = fVar159 * fVar86;
  auVar24._16_4_ = fVar88 * 0.0;
  auVar24._20_4_ = fVar159 * 0.0;
  auVar24._24_4_ = fVar88 * 0.0;
  auVar24._28_4_ = fVar159;
  auVar92 = vfmadd231ps_fma(auVar24,auVar81,auVar175);
  auVar16 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar73));
  fVar88 = auVar248._0_4_;
  fVar159 = auVar248._4_4_;
  auVar25._4_4_ = fVar159 * fVar89;
  auVar25._0_4_ = fVar88 * fVar87;
  auVar25._8_4_ = fVar88 * fVar120;
  auVar25._12_4_ = fVar159 * fVar86;
  auVar25._16_4_ = fVar88 * 0.0;
  auVar25._20_4_ = fVar159 * 0.0;
  auVar25._24_4_ = fVar88 * 0.0;
  auVar25._28_4_ = fVar159;
  auVar248 = vfmadd231ps_fma(auVar25,auVar81,auVar283);
  auVar26._28_4_ = fVar222;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar7._12_4_ * fVar86,
                          CONCAT48(auVar7._8_4_ * fVar120,
                                   CONCAT44(auVar7._4_4_ * fVar89,auVar7._0_4_ * fVar87))));
  auVar8 = vfmadd231ps_fma(auVar26,auVar81,ZEXT1632(auVar8));
  auVar279 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar111._12_4_,
                                                CONCAT48(fVar120 * auVar111._8_4_,
                                                         CONCAT44(fVar89 * auVar111._4_4_,
                                                                  fVar87 * auVar111._0_4_)))),
                             auVar81,ZEXT1632(auVar279));
  auVar108._0_4_ = auVar208._0_4_ + auVar255._0_4_;
  auVar108._4_4_ = auVar208._4_4_ + auVar255._4_4_;
  auVar108._8_4_ = auVar208._8_4_ + auVar255._8_4_;
  auVar108._12_4_ = auVar208._12_4_ + auVar255._12_4_;
  auVar108._16_4_ = auVar255._16_4_ + 0.0;
  auVar108._20_4_ = auVar255._20_4_ + 0.0;
  auVar108._24_4_ = auVar255._24_4_ + 0.0;
  auVar108._28_4_ = 0;
  auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * fVar86,
                                              CONCAT48(auVar92._8_4_ * fVar120,
                                                       CONCAT44(auVar92._4_4_ * fVar89,
                                                                auVar92._0_4_ * fVar87)))),auVar81,
                           ZEXT1632(auVar7));
  auVar111 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar248._12_4_ * fVar86,
                                                CONCAT48(auVar248._8_4_ * fVar120,
                                                         CONCAT44(auVar248._4_4_ * fVar89,
                                                                  auVar248._0_4_ * fVar87)))),
                             auVar81,ZEXT1632(auVar111));
  auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar7._12_4_,
                                               CONCAT48(fVar120 * auVar7._8_4_,
                                                        CONCAT44(fVar89 * auVar7._4_4_,
                                                                 fVar87 * auVar7._0_4_)))),auVar81,
                            ZEXT1632(auVar8));
  auVar248 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar111._12_4_ * fVar86,
                                                CONCAT48(auVar111._8_4_ * fVar120,
                                                         CONCAT44(auVar111._4_4_ * fVar89,
                                                                  auVar111._0_4_ * fVar87)))),
                             ZEXT1632(auVar279),auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar14 = vsubps_avx(ZEXT1632(auVar111),ZEXT1632(auVar279));
  auVar276._0_4_ = fStack_228 * auVar81._0_4_ * 3.0;
  auVar276._4_4_ = fStack_228 * auVar81._4_4_ * 3.0;
  auVar276._8_4_ = fStack_228 * auVar81._8_4_ * 3.0;
  auVar276._12_4_ = fStack_228 * auVar81._12_4_ * 3.0;
  auVar276._16_4_ = fStack_228 * auVar81._16_4_ * 3.0;
  auVar276._20_4_ = fStack_228 * auVar81._20_4_ * 3.0;
  auVar276._24_4_ = fStack_228 * auVar81._24_4_ * 3.0;
  auVar276._28_4_ = 0;
  local_240 = fStack_228 * auVar14._0_4_ * 3.0;
  fStack_23c = fStack_228 * auVar14._4_4_ * 3.0;
  auVar27._4_4_ = fStack_23c;
  auVar27._0_4_ = local_240;
  fStack_238 = fStack_228 * auVar14._8_4_ * 3.0;
  auVar27._8_4_ = fStack_238;
  fStack_234 = fStack_228 * auVar14._12_4_ * 3.0;
  auVar27._12_4_ = fStack_234;
  fStack_230 = fStack_228 * auVar14._16_4_ * 3.0;
  auVar27._16_4_ = fStack_230;
  fStack_22c = fStack_228 * auVar14._20_4_ * 3.0;
  auVar27._20_4_ = fStack_22c;
  fStack_228 = fStack_228 * auVar14._24_4_ * 3.0;
  auVar27._24_4_ = fStack_228;
  auVar27._28_4_ = 0x40400000;
  auVar17 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar92));
  local_4a0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar248));
  auVar81 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar208));
  auVar14 = vsubps_avx(ZEXT1632(auVar248),ZEXT1632(auVar73));
  auVar82 = vsubps_avx(auVar17,auVar15);
  fVar258 = auVar81._0_4_ + auVar82._0_4_;
  fVar259 = auVar81._4_4_ + auVar82._4_4_;
  fVar190 = auVar81._8_4_ + auVar82._8_4_;
  fVar191 = auVar81._12_4_ + auVar82._12_4_;
  fVar192 = auVar81._16_4_ + auVar82._16_4_;
  fVar193 = auVar81._20_4_ + auVar82._20_4_;
  fVar194 = auVar81._24_4_ + auVar82._24_4_;
  auVar13 = vsubps_avx(local_4a0,auVar16);
  auVar83._0_4_ = auVar14._0_4_ + auVar13._0_4_;
  auVar83._4_4_ = auVar14._4_4_ + auVar13._4_4_;
  auVar83._8_4_ = auVar14._8_4_ + auVar13._8_4_;
  auVar83._12_4_ = auVar14._12_4_ + auVar13._12_4_;
  auVar83._16_4_ = auVar14._16_4_ + auVar13._16_4_;
  auVar83._20_4_ = auVar14._20_4_ + auVar13._20_4_;
  auVar83._24_4_ = auVar14._24_4_ + auVar13._24_4_;
  auVar83._28_4_ = auVar14._28_4_ + auVar13._28_4_;
  local_1e0 = ZEXT1632(auVar73);
  fVar87 = auVar73._0_4_;
  local_260 = (float)local_5e0._0_4_ + fVar87;
  fVar89 = auVar73._4_4_;
  fStack_25c = (float)local_5e0._4_4_ + fVar89;
  fVar120 = auVar73._8_4_;
  fStack_258 = fStack_5d8 + fVar120;
  fVar86 = auVar73._12_4_;
  fStack_254 = fStack_5d4 + fVar86;
  fStack_250 = fStack_5d0 + 0.0;
  fStack_24c = fStack_5cc + 0.0;
  fStack_248 = fStack_5c8 + 0.0;
  local_4c0 = ZEXT1632(auVar208);
  auVar14 = vsubps_avx(local_4c0,auVar255);
  local_1c0 = vpermps_avx2(_DAT_01fec480,auVar14);
  auVar14 = vsubps_avx(local_1e0,_local_5e0);
  local_280 = vpermps_avx2(_DAT_01fec480,auVar14);
  local_200._0_4_ = auVar92._0_4_ + auVar276._0_4_;
  local_200._4_4_ = auVar92._4_4_ + auVar276._4_4_;
  local_200._8_4_ = auVar92._8_4_ + auVar276._8_4_;
  local_200._12_4_ = auVar92._12_4_ + auVar276._12_4_;
  local_200._16_4_ = auVar276._16_4_ + 0.0;
  local_200._20_4_ = auVar276._20_4_ + 0.0;
  local_200._24_4_ = auVar276._24_4_ + 0.0;
  local_200._28_4_ = 0;
  auVar220 = ZEXT3264(local_200);
  auVar256 = ZEXT1632(auVar92);
  auVar14 = vsubps_avx(auVar256,auVar276);
  auVar18 = vpermps_avx2(_DAT_01fec480,auVar14);
  fVar88 = auVar248._0_4_;
  local_240 = fVar88 + local_240;
  fVar159 = auVar248._4_4_;
  fStack_23c = fVar159 + fStack_23c;
  fVar61 = auVar248._8_4_;
  fStack_238 = fVar61 + fStack_238;
  fVar222 = auVar248._12_4_;
  fStack_234 = fVar222 + fStack_234;
  fStack_230 = fStack_230 + 0.0;
  fStack_22c = fStack_22c + 0.0;
  fStack_228 = fStack_228 + 0.0;
  auVar14 = vsubps_avx(ZEXT1632(auVar248),auVar27);
  local_220 = vpermps_avx2(_DAT_01fec480,auVar14);
  auVar28._4_4_ = fVar89 * fVar259;
  auVar28._0_4_ = fVar87 * fVar258;
  auVar28._8_4_ = fVar120 * fVar190;
  auVar28._12_4_ = fVar86 * fVar191;
  auVar28._16_4_ = fVar192 * 0.0;
  auVar28._20_4_ = fVar193 * 0.0;
  auVar28._24_4_ = fVar194 * 0.0;
  auVar28._28_4_ = auVar14._28_4_;
  auVar7 = vfnmadd231ps_fma(auVar28,local_4c0,auVar83);
  fStack_244 = fStack_5c4 + 0.0;
  auVar29._4_4_ = fStack_25c * fVar259;
  auVar29._0_4_ = local_260 * fVar258;
  auVar29._8_4_ = fStack_258 * fVar190;
  auVar29._12_4_ = fStack_254 * fVar191;
  auVar29._16_4_ = fStack_250 * fVar192;
  auVar29._20_4_ = fStack_24c * fVar193;
  auVar29._24_4_ = fStack_248 * fVar194;
  auVar29._28_4_ = 0;
  auVar8 = vfnmadd231ps_fma(auVar29,auVar83,auVar108);
  auVar30._4_4_ = local_280._4_4_ * fVar259;
  auVar30._0_4_ = local_280._0_4_ * fVar258;
  auVar30._8_4_ = local_280._8_4_ * fVar190;
  auVar30._12_4_ = local_280._12_4_ * fVar191;
  auVar30._16_4_ = local_280._16_4_ * fVar192;
  auVar30._20_4_ = local_280._20_4_ * fVar193;
  auVar30._24_4_ = local_280._24_4_ * fVar194;
  auVar30._28_4_ = fStack_5c4 + 0.0;
  auVar279 = vfnmadd231ps_fma(auVar30,local_1c0,auVar83);
  local_780._0_4_ = auVar16._0_4_;
  local_780._4_4_ = auVar16._4_4_;
  uStack_778._0_4_ = auVar16._8_4_;
  uStack_778._4_4_ = auVar16._12_4_;
  uStack_770._0_4_ = auVar16._16_4_;
  uStack_770._4_4_ = auVar16._20_4_;
  uStack_768._0_4_ = auVar16._24_4_;
  uStack_768._4_4_ = auVar16._28_4_;
  auVar31._4_4_ = (float)local_780._4_4_ * fVar259;
  auVar31._0_4_ = (float)local_780._0_4_ * fVar258;
  auVar31._8_4_ = (float)uStack_778 * fVar190;
  auVar31._12_4_ = uStack_778._4_4_ * fVar191;
  auVar31._16_4_ = (float)uStack_770 * fVar192;
  auVar31._20_4_ = uStack_770._4_4_ * fVar193;
  auVar31._24_4_ = (float)uStack_768 * fVar194;
  auVar31._28_4_ = uStack_768._4_4_;
  auVar111 = vfnmadd231ps_fma(auVar31,auVar15,auVar83);
  auVar205._0_4_ = fVar88 * fVar258;
  auVar205._4_4_ = fVar159 * fVar259;
  auVar205._8_4_ = fVar61 * fVar190;
  auVar205._12_4_ = fVar222 * fVar191;
  auVar205._16_4_ = fVar192 * 0.0;
  auVar205._20_4_ = fVar193 * 0.0;
  auVar205._24_4_ = fVar194 * 0.0;
  auVar205._28_4_ = 0;
  auVar92 = vfnmadd231ps_fma(auVar205,auVar256,auVar83);
  uStack_224 = 0x40400000;
  auVar32._4_4_ = fStack_23c * fVar259;
  auVar32._0_4_ = local_240 * fVar258;
  auVar32._8_4_ = fStack_238 * fVar190;
  auVar32._12_4_ = fStack_234 * fVar191;
  auVar32._16_4_ = fStack_230 * fVar192;
  auVar32._20_4_ = fStack_22c * fVar193;
  auVar32._24_4_ = fStack_228 * fVar194;
  auVar32._28_4_ = auVar15._28_4_;
  auVar73 = vfnmadd231ps_fma(auVar32,local_200,auVar83);
  auVar33._4_4_ = local_220._4_4_ * fVar259;
  auVar33._0_4_ = local_220._0_4_ * fVar258;
  auVar33._8_4_ = local_220._8_4_ * fVar190;
  auVar33._12_4_ = local_220._12_4_ * fVar191;
  auVar33._16_4_ = local_220._16_4_ * fVar192;
  auVar33._20_4_ = local_220._20_4_ * fVar193;
  auVar33._24_4_ = local_220._24_4_ * fVar194;
  auVar33._28_4_ = local_220._28_4_;
  auVar179 = vfnmadd231ps_fma(auVar33,auVar18,auVar83);
  auVar34._4_4_ = local_4a0._4_4_ * fVar259;
  auVar34._0_4_ = local_4a0._0_4_ * fVar258;
  auVar34._8_4_ = local_4a0._8_4_ * fVar190;
  auVar34._12_4_ = local_4a0._12_4_ * fVar191;
  auVar34._16_4_ = local_4a0._16_4_ * fVar192;
  auVar34._20_4_ = local_4a0._20_4_ * fVar193;
  auVar34._24_4_ = local_4a0._24_4_ * fVar194;
  auVar34._28_4_ = auVar81._28_4_ + auVar82._28_4_;
  auVar239 = vfnmadd231ps_fma(auVar34,auVar17,auVar83);
  auVar14 = vminps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar81 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar82 = vminps_avx(ZEXT1632(auVar279),ZEXT1632(auVar111));
  auVar82 = vminps_avx(auVar14,auVar82);
  auVar14 = vmaxps_avx(ZEXT1632(auVar279),ZEXT1632(auVar111));
  auVar81 = vmaxps_avx(auVar81,auVar14);
  auVar13 = vminps_avx(ZEXT1632(auVar92),ZEXT1632(auVar73));
  auVar14 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar73));
  auVar9 = vminps_avx(ZEXT1632(auVar179),ZEXT1632(auVar239));
  auVar13 = vminps_avx(auVar13,auVar9);
  auVar13 = vminps_avx(auVar82,auVar13);
  auVar82 = vmaxps_avx(ZEXT1632(auVar179),ZEXT1632(auVar239));
  auVar14 = vmaxps_avx(auVar14,auVar82);
  auVar14 = vmaxps_avx(auVar81,auVar14);
  auVar45._4_4_ = fStack_33c;
  auVar45._0_4_ = local_340;
  auVar45._8_4_ = fStack_338;
  auVar45._12_4_ = fStack_334;
  auVar45._16_4_ = fStack_330;
  auVar45._20_4_ = fStack_32c;
  auVar45._24_4_ = fStack_328;
  auVar45._28_4_ = fStack_324;
  auVar81 = vcmpps_avx(auVar13,auVar45,2);
  auVar43._4_4_ = fStack_35c;
  auVar43._0_4_ = local_360;
  auVar43._8_4_ = fStack_358;
  auVar43._12_4_ = fStack_354;
  auVar43._16_4_ = fStack_350;
  auVar43._20_4_ = fStack_34c;
  auVar43._24_4_ = fStack_348;
  auVar43._28_4_ = fStack_344;
  auVar14 = vcmpps_avx(auVar14,auVar43,5);
  auVar81 = vandps_avx(auVar14,auVar81);
  auVar14 = local_2a0 & auVar81;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0x7f,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar14 >> 0xbf,0) != '\0') ||
      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0') {
    auVar14 = vsubps_avx(auVar15,local_4c0);
    auVar82 = vsubps_avx(auVar17,auVar256);
    fVar259 = auVar14._0_4_ + auVar82._0_4_;
    fVar190 = auVar14._4_4_ + auVar82._4_4_;
    fVar191 = auVar14._8_4_ + auVar82._8_4_;
    fVar192 = auVar14._12_4_ + auVar82._12_4_;
    fVar193 = auVar14._16_4_ + auVar82._16_4_;
    fVar194 = auVar14._20_4_ + auVar82._20_4_;
    fVar90 = auVar14._24_4_ + auVar82._24_4_;
    auVar13 = vsubps_avx(auVar16,local_1e0);
    auVar9 = vsubps_avx(local_4a0,ZEXT1632(auVar248));
    auVar109._0_4_ = auVar13._0_4_ + auVar9._0_4_;
    auVar109._4_4_ = auVar13._4_4_ + auVar9._4_4_;
    auVar109._8_4_ = auVar13._8_4_ + auVar9._8_4_;
    auVar109._12_4_ = auVar13._12_4_ + auVar9._12_4_;
    auVar109._16_4_ = auVar13._16_4_ + auVar9._16_4_;
    auVar109._20_4_ = auVar13._20_4_ + auVar9._20_4_;
    auVar109._24_4_ = auVar13._24_4_ + auVar9._24_4_;
    fVar258 = auVar9._28_4_;
    auVar109._28_4_ = auVar13._28_4_ + fVar258;
    auVar35._4_4_ = fVar89 * fVar190;
    auVar35._0_4_ = fVar87 * fVar259;
    auVar35._8_4_ = fVar120 * fVar191;
    auVar35._12_4_ = fVar86 * fVar192;
    auVar35._16_4_ = fVar193 * 0.0;
    auVar35._20_4_ = fVar194 * 0.0;
    auVar35._24_4_ = fVar90 * 0.0;
    auVar35._28_4_ = auVar17._28_4_;
    auVar92 = vfnmadd231ps_fma(auVar35,auVar109,local_4c0);
    auVar36._4_4_ = fVar190 * fStack_25c;
    auVar36._0_4_ = fVar259 * local_260;
    auVar36._8_4_ = fVar191 * fStack_258;
    auVar36._12_4_ = fVar192 * fStack_254;
    auVar36._16_4_ = fVar193 * fStack_250;
    auVar36._20_4_ = fVar194 * fStack_24c;
    auVar36._24_4_ = fVar90 * fStack_248;
    auVar36._28_4_ = 0;
    auVar7 = vfnmadd213ps_fma(auVar108,auVar109,auVar36);
    auVar37._4_4_ = fVar190 * local_280._4_4_;
    auVar37._0_4_ = fVar259 * local_280._0_4_;
    auVar37._8_4_ = fVar191 * local_280._8_4_;
    auVar37._12_4_ = fVar192 * local_280._12_4_;
    auVar37._16_4_ = fVar193 * local_280._16_4_;
    auVar37._20_4_ = fVar194 * local_280._20_4_;
    auVar37._24_4_ = fVar90 * local_280._24_4_;
    auVar37._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(local_1c0,auVar109,auVar37);
    auVar38._4_4_ = (float)local_780._4_4_ * fVar190;
    auVar38._0_4_ = (float)local_780._0_4_ * fVar259;
    auVar38._8_4_ = (float)uStack_778 * fVar191;
    auVar38._12_4_ = uStack_778._4_4_ * fVar192;
    auVar38._16_4_ = (float)uStack_770 * fVar193;
    auVar38._20_4_ = uStack_770._4_4_ * fVar194;
    auVar38._24_4_ = (float)uStack_768 * fVar90;
    auVar38._28_4_ = 0;
    auVar248 = vfnmadd231ps_fma(auVar38,auVar109,auVar15);
    auVar131._0_4_ = fVar88 * fVar259;
    auVar131._4_4_ = fVar159 * fVar190;
    auVar131._8_4_ = fVar61 * fVar191;
    auVar131._12_4_ = fVar222 * fVar192;
    auVar131._16_4_ = fVar193 * 0.0;
    auVar131._20_4_ = fVar194 * 0.0;
    auVar131._24_4_ = fVar90 * 0.0;
    auVar131._28_4_ = 0;
    auVar73 = vfnmadd231ps_fma(auVar131,auVar109,auVar256);
    auVar39._4_4_ = fVar190 * fStack_23c;
    auVar39._0_4_ = fVar259 * local_240;
    auVar39._8_4_ = fVar191 * fStack_238;
    auVar39._12_4_ = fVar192 * fStack_234;
    auVar39._16_4_ = fVar193 * fStack_230;
    auVar39._20_4_ = fVar194 * fStack_22c;
    auVar39._24_4_ = fVar90 * fStack_228;
    auVar39._28_4_ = fVar258;
    auVar279 = vfnmadd213ps_fma(local_200,auVar109,auVar39);
    auVar40._4_4_ = fVar190 * local_220._4_4_;
    auVar40._0_4_ = fVar259 * local_220._0_4_;
    auVar40._8_4_ = fVar191 * local_220._8_4_;
    auVar40._12_4_ = fVar192 * local_220._12_4_;
    auVar40._16_4_ = fVar193 * local_220._16_4_;
    auVar40._20_4_ = fVar194 * local_220._20_4_;
    auVar40._24_4_ = fVar90 * local_220._24_4_;
    auVar40._28_4_ = fVar258;
    auVar111 = vfnmadd213ps_fma(auVar18,auVar109,auVar40);
    auVar220 = ZEXT1664(auVar111);
    auVar41._4_4_ = local_4a0._4_4_ * fVar190;
    auVar41._0_4_ = local_4a0._0_4_ * fVar259;
    auVar41._8_4_ = local_4a0._8_4_ * fVar191;
    auVar41._12_4_ = local_4a0._12_4_ * fVar192;
    auVar41._16_4_ = local_4a0._16_4_ * fVar193;
    auVar41._20_4_ = local_4a0._20_4_ * fVar194;
    auVar41._24_4_ = local_4a0._24_4_ * fVar90;
    auVar41._28_4_ = auVar14._28_4_ + auVar82._28_4_;
    auVar179 = vfnmadd231ps_fma(auVar41,auVar17,auVar109);
    auVar82 = vminps_avx(ZEXT1632(auVar92),ZEXT1632(auVar7));
    auVar14 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar7));
    auVar13 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar248));
    auVar13 = vminps_avx(auVar82,auVar13);
    auVar82 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar248));
    auVar14 = vmaxps_avx(auVar14,auVar82);
    auVar9 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar279));
    auVar82 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar279));
    auVar15 = vminps_avx(ZEXT1632(auVar111),ZEXT1632(auVar179));
    auVar9 = vminps_avx(auVar9,auVar15);
    auVar9 = vminps_avx(auVar13,auVar9);
    auVar13 = vmaxps_avx(ZEXT1632(auVar111),ZEXT1632(auVar179));
    auVar82 = vmaxps_avx(auVar82,auVar13);
    auVar82 = vmaxps_avx(auVar14,auVar82);
    auVar46._4_4_ = fStack_33c;
    auVar46._0_4_ = local_340;
    auVar46._8_4_ = fStack_338;
    auVar46._12_4_ = fStack_334;
    auVar46._16_4_ = fStack_330;
    auVar46._20_4_ = fStack_32c;
    auVar46._24_4_ = fStack_328;
    auVar46._28_4_ = fStack_324;
    auVar14 = vcmpps_avx(auVar9,auVar46,2);
    auVar44._4_4_ = fStack_35c;
    auVar44._0_4_ = local_360;
    auVar44._8_4_ = fStack_358;
    auVar44._12_4_ = fStack_354;
    auVar44._16_4_ = fStack_350;
    auVar44._20_4_ = fStack_34c;
    auVar44._24_4_ = fStack_348;
    auVar44._28_4_ = fStack_344;
    auVar82 = vcmpps_avx(auVar82,auVar44,5);
    auVar14 = vandps_avx(auVar82,auVar14);
    auVar81 = vandps_avx(local_2a0,auVar81);
    auVar82 = auVar81 & auVar14;
    if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar82 >> 0x7f,0) != '\0') ||
          (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar82 >> 0xbf,0) != '\0') ||
        (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar82[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar14,auVar81);
      uVar53 = vmovmskps_avx(auVar81);
      if (uVar53 != 0) {
        auStack_500[uVar49] = uVar53 & 0xff;
        uVar91 = vmovlps_avx(local_410);
        *(undefined8 *)(&uStack_320 + uVar49 * 2) = uVar91;
        uVar57 = vmovlps_avx(auVar68);
        auStack_1a0[uVar49] = uVar57;
        uVar49 = (ulong)((int)uVar49 + 1);
      }
    }
  }
LAB_015ae1ec:
  if ((int)uVar49 != 0) {
    uVar54 = (int)uVar49 - 1;
    uVar55 = (ulong)uVar54;
    uVar51 = auStack_500[uVar55];
    uVar53 = (&uStack_320)[uVar55 * 2];
    fVar87 = afStack_31c[uVar55 * 2];
    iVar48 = 0;
    for (uVar57 = (ulong)uVar51; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
      iVar48 = iVar48 + 1;
    }
    uVar51 = uVar51 - 1 & uVar51;
    if (uVar51 == 0) {
      uVar49 = (ulong)uVar54;
    }
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auStack_1a0[uVar55];
    auStack_500[uVar55] = uVar51;
    fVar89 = (float)(iVar48 + 1) * 0.14285715;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * (float)iVar48 * 0.14285715)),ZEXT416(uVar53),
                             ZEXT416((uint)(1.0 - (float)iVar48 * 0.14285715)));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * fVar89)),ZEXT416(uVar53),
                             ZEXT416((uint)(1.0 - fVar89)));
    fVar89 = auVar8._0_4_;
    auVar189._0_4_ = auVar7._0_4_;
    fVar87 = fVar89 - auVar189._0_4_;
    if (fVar87 < 0.16666667) {
      auVar279 = vshufps_avx(auVar68,auVar68,0x50);
      auVar99._8_4_ = 0x3f800000;
      auVar99._0_8_ = 0x3f8000003f800000;
      auVar99._12_4_ = 0x3f800000;
      auVar111 = vsubps_avx(auVar99,auVar279);
      fVar120 = auVar279._0_4_;
      auVar137._0_4_ = fVar120 * fVar133;
      fVar86 = auVar279._4_4_;
      auVar137._4_4_ = fVar86 * fVar142;
      fVar88 = auVar279._8_4_;
      auVar137._8_4_ = fVar88 * fVar133;
      fVar159 = auVar279._12_4_;
      auVar137._12_4_ = fVar159 * fVar142;
      auVar148._0_4_ = fVar120 * fVar243;
      auVar148._4_4_ = fVar86 * fVar257;
      auVar148._8_4_ = fVar88 * fVar243;
      auVar148._12_4_ = fVar159 * fVar257;
      auVar172._0_4_ = fVar120 * fVar195;
      auVar172._4_4_ = fVar86 * fVar206;
      auVar172._8_4_ = fVar88 * fVar195;
      auVar172._12_4_ = fVar159 * fVar206;
      auVar70._0_4_ = fVar120 * fVar207;
      auVar70._4_4_ = fVar86 * fVar221;
      auVar70._8_4_ = fVar88 * fVar207;
      auVar70._12_4_ = fVar159 * fVar221;
      auVar279 = vfmadd231ps_fma(auVar137,auVar111,auVar182);
      auVar92 = vfmadd231ps_fma(auVar148,auVar111,auVar227);
      auVar248 = vfmadd231ps_fma(auVar172,auVar111,auVar247);
      auVar111 = vfmadd231ps_fma(auVar70,auVar111,auVar262);
      auVar132._16_16_ = auVar279;
      auVar132._0_16_ = auVar279;
      auVar141._16_16_ = auVar92;
      auVar141._0_16_ = auVar92;
      auVar157._16_16_ = auVar248;
      auVar157._0_16_ = auVar248;
      auVar189._4_4_ = auVar189._0_4_;
      auVar189._8_4_ = auVar189._0_4_;
      auVar189._12_4_ = auVar189._0_4_;
      auVar189._20_4_ = fVar89;
      auVar189._16_4_ = fVar89;
      auVar189._24_4_ = fVar89;
      auVar189._28_4_ = fVar89;
      auVar81 = vsubps_avx(auVar141,auVar132);
      auVar92 = vfmadd213ps_fma(auVar81,auVar189,auVar132);
      auVar81 = vsubps_avx(auVar157,auVar141);
      auVar73 = vfmadd213ps_fma(auVar81,auVar189,auVar141);
      auVar279 = vsubps_avx(auVar111,auVar248);
      auVar84._16_16_ = auVar279;
      auVar84._0_16_ = auVar279;
      auVar279 = vfmadd213ps_fma(auVar84,auVar189,auVar157);
      auVar81 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar92));
      auVar111 = vfmadd213ps_fma(auVar81,auVar189,ZEXT1632(auVar92));
      auVar81 = vsubps_avx(ZEXT1632(auVar279),ZEXT1632(auVar73));
      auVar279 = vfmadd213ps_fma(auVar81,auVar189,ZEXT1632(auVar73));
      auVar81 = vsubps_avx(ZEXT1632(auVar279),ZEXT1632(auVar111));
      auVar196 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar81,auVar189);
      fVar222 = auVar81._4_4_ * 3.0;
      fVar120 = fVar87 * 0.33333334;
      local_4a0._0_8_ =
           CONCAT44(auVar196._4_4_ + fVar120 * fVar222,
                    auVar196._0_4_ + fVar120 * auVar81._0_4_ * 3.0);
      local_4a0._8_4_ = auVar196._8_4_ + fVar120 * auVar81._8_4_ * 3.0;
      local_4a0._12_4_ = auVar196._12_4_ + fVar120 * auVar81._12_4_ * 3.0;
      auVar111 = vshufpd_avx(auVar196,auVar196,3);
      auVar92 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar279 = vsubps_avx(auVar111,auVar196);
      auVar248 = vsubps_avx(auVar92,(undefined1  [16])0x0);
      auVar71._0_4_ = auVar279._0_4_ + auVar248._0_4_;
      auVar71._4_4_ = auVar279._4_4_ + auVar248._4_4_;
      auVar71._8_4_ = auVar279._8_4_ + auVar248._8_4_;
      auVar71._12_4_ = auVar279._12_4_ + auVar248._12_4_;
      auVar279 = vshufps_avx(auVar196,auVar196,0xb1);
      auVar248 = vshufps_avx(local_4a0._0_16_,local_4a0._0_16_,0xb1);
      auVar272._4_4_ = auVar71._0_4_;
      auVar272._0_4_ = auVar71._0_4_;
      auVar272._8_4_ = auVar71._0_4_;
      auVar272._12_4_ = auVar71._0_4_;
      auVar73 = vshufps_avx(auVar71,auVar71,0x55);
      fVar86 = auVar73._0_4_;
      auVar72._0_4_ = fVar86 * auVar279._0_4_;
      fVar88 = auVar73._4_4_;
      auVar72._4_4_ = fVar88 * auVar279._4_4_;
      fVar159 = auVar73._8_4_;
      auVar72._8_4_ = fVar159 * auVar279._8_4_;
      fVar61 = auVar73._12_4_;
      auVar72._12_4_ = fVar61 * auVar279._12_4_;
      auVar149._0_4_ = fVar86 * auVar248._0_4_;
      auVar149._4_4_ = fVar88 * auVar248._4_4_;
      auVar149._8_4_ = fVar159 * auVar248._8_4_;
      auVar149._12_4_ = fVar61 * auVar248._12_4_;
      auVar179 = vfmadd231ps_fma(auVar72,auVar272,auVar196);
      auVar239 = vfmadd231ps_fma(auVar149,auVar272,local_4a0._0_16_);
      auVar248 = vshufps_avx(auVar179,auVar179,0xe8);
      auVar73 = vshufps_avx(auVar239,auVar239,0xe8);
      auVar279 = vcmpps_avx(auVar248,auVar73,1);
      uVar53 = vextractps_avx(auVar279,0);
      auVar208 = auVar239;
      if ((uVar53 & 1) == 0) {
        auVar208 = auVar179;
      }
      auVar123._0_4_ = fVar120 * auVar81._16_4_ * 3.0;
      auVar123._4_4_ = fVar120 * fVar222;
      auVar123._8_4_ = fVar120 * auVar81._24_4_ * 3.0;
      auVar123._12_4_ = fVar120 * auVar220._28_4_;
      local_4c0._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar123);
      auVar124 = vshufps_avx(local_4c0._0_16_,local_4c0._0_16_,0xb1);
      auVar237 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar183._0_4_ = fVar86 * auVar124._0_4_;
      auVar183._4_4_ = fVar88 * auVar124._4_4_;
      auVar183._8_4_ = fVar159 * auVar124._8_4_;
      auVar183._12_4_ = fVar61 * auVar124._12_4_;
      auVar199._0_4_ = auVar237._0_4_ * fVar86;
      auVar199._4_4_ = auVar237._4_4_ * fVar88;
      auVar199._8_4_ = auVar237._8_4_ * fVar159;
      auVar199._12_4_ = auVar237._12_4_ * fVar61;
      auVar270 = vfmadd231ps_fma(auVar183,auVar272,local_4c0._0_16_);
      auVar19 = vfmadd231ps_fma(auVar199,(undefined1  [16])0x0,auVar272);
      auVar237 = vshufps_avx(auVar270,auVar270,0xe8);
      auVar269 = vshufps_avx(auVar19,auVar19,0xe8);
      auVar220 = ZEXT1664(auVar269);
      auVar124 = vcmpps_avx(auVar237,auVar269,1);
      uVar53 = vextractps_avx(auVar124,0);
      auVar228 = auVar19;
      if ((uVar53 & 1) == 0) {
        auVar228 = auVar270;
      }
      auVar208 = vmaxss_avx(auVar228,auVar208);
      auVar248 = vminps_avx(auVar248,auVar73);
      auVar73 = vminps_avx(auVar237,auVar269);
      auVar73 = vminps_avx(auVar248,auVar73);
      auVar279 = vshufps_avx(auVar279,auVar279,0x55);
      auVar279 = vblendps_avx(auVar279,auVar124,2);
      auVar124 = vpslld_avx(auVar279,0x1f);
      auVar279 = vshufpd_avx(auVar239,auVar239,1);
      auVar279 = vinsertps_avx(auVar279,auVar19,0x9c);
      auVar248 = vshufpd_avx(auVar179,auVar179,1);
      auVar248 = vinsertps_avx(auVar248,auVar270,0x9c);
      auVar279 = vblendvps_avx(auVar248,auVar279,auVar124);
      auVar248 = vmovshdup_avx(auVar279);
      auVar279 = vmaxss_avx(auVar248,auVar279);
      fVar159 = auVar73._0_4_;
      auVar248 = vmovshdup_avx(auVar73);
      fVar88 = auVar279._0_4_;
      fVar120 = auVar248._0_4_;
      fVar86 = auVar208._0_4_;
      if (((0.0001 <= fVar159) || (fVar88 <= -0.0001)) && (0.0001 <= fVar120 || fVar88 <= -0.0001))
      goto code_r0x015ae50c;
      goto LAB_015ae533;
    }
    local_410 = vinsertps_avx(auVar7,auVar8,0x10);
    goto LAB_015adc2e;
  }
  if (bVar58) {
    return bVar58;
  }
  uVar60 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar80._4_4_ = uVar60;
  auVar80._0_4_ = uVar60;
  auVar80._8_4_ = uVar60;
  auVar80._12_4_ = uVar60;
  auVar7 = vcmpps_avx(local_420,auVar80,2);
  uVar47 = vmovmskps_avx(auVar7);
  uVar47 = (uint)uVar56 & uVar47;
  if (uVar47 == 0) {
    return bVar58;
  }
  goto LAB_015ad465;
code_r0x015ae50c:
  auVar248 = vcmpps_avx(auVar248,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar179 = vcmpps_avx(auVar73,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar248 = vandps_avx(auVar179,auVar248);
  if (fVar86 <= -0.0001 || (auVar248 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_015ae1ec;
LAB_015ae533:
  auVar179 = vcmpps_avx(auVar73,_DAT_01f7aa10,1);
  auVar239 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar248 = vcmpss_avx(auVar208,ZEXT816(0) << 0x20,1);
  auVar114._8_4_ = 0xbf800000;
  auVar114._0_8_ = 0xbf800000bf800000;
  auVar114._12_4_ = 0xbf800000;
  auVar248 = vblendvps_avx(auVar99,auVar114,auVar248);
  auVar179 = vblendvps_avx(auVar99,auVar114,auVar179);
  fVar222 = auVar179._0_4_;
  fVar61 = auVar248._0_4_;
  auVar248 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar222 == fVar61) && (!NAN(fVar222) && !NAN(fVar61))) {
    auVar248 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar222 == fVar61) && (!NAN(fVar222) && !NAN(fVar61))) {
    auVar239 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar179 = vmovshdup_avx(auVar179);
  fVar258 = auVar179._0_4_;
  if ((fVar222 != fVar258) || (NAN(fVar222) || NAN(fVar258))) {
    auVar184._12_4_ = 0;
    auVar184._0_12_ = ZEXT812(0);
    auVar184 = auVar184 << 0x20;
    if ((fVar120 != fVar159) || (NAN(fVar120) || NAN(fVar159))) {
      auVar125._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
      auVar125._8_4_ = auVar73._8_4_ ^ 0x80000000;
      auVar125._12_4_ = auVar73._12_4_ ^ 0x80000000;
      auVar126._0_4_ = -fVar159 / (fVar120 - fVar159);
      auVar126._4_12_ = auVar125._4_12_;
      auVar73 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar184,auVar126);
      auVar179 = auVar73;
    }
    else {
      auVar73 = ZEXT816(0) << 0x20;
      if ((fVar159 != 0.0) || (auVar179 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar159))) {
        auVar73 = SUB6416(ZEXT464(0x7f800000),0);
        auVar179 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar248 = vminss_avx(auVar248,auVar73);
    auVar239 = vmaxss_avx(auVar179,auVar239);
  }
  else {
    auVar42._12_4_ = 0;
    auVar42._0_12_ = ZEXT812(0);
    auVar184 = auVar42 << 0x20;
  }
  auVar279 = vcmpss_avx(auVar279,auVar184,1);
  auVar115._8_4_ = 0xbf800000;
  auVar115._0_8_ = 0xbf800000bf800000;
  auVar115._12_4_ = 0xbf800000;
  auVar279 = vblendvps_avx(auVar99,auVar115,auVar279);
  fVar120 = auVar279._0_4_;
  auVar279 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar61 != fVar120) || (NAN(fVar61) || NAN(fVar120))) {
    if ((fVar88 != fVar86) || (NAN(fVar88) || NAN(fVar86))) {
      auVar74._0_8_ = auVar208._0_8_ ^ 0x8000000080000000;
      auVar74._8_4_ = auVar208._8_4_ ^ 0x80000000;
      auVar74._12_4_ = auVar208._12_4_ ^ 0x80000000;
      auVar127._0_4_ = -fVar86 / (fVar88 - fVar86);
      auVar127._4_12_ = auVar74._4_12_;
      auVar73 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar184,auVar127);
      auVar179 = auVar73;
    }
    else {
      auVar73 = ZEXT816(0) << 0x20;
      if ((fVar86 != 0.0) || (auVar179 = auVar279, NAN(fVar86))) {
        auVar73 = SUB6416(ZEXT464(0x7f800000),0);
        auVar179 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar248 = vminss_avx(auVar248,auVar73);
    auVar239 = vmaxss_avx(auVar179,auVar239);
  }
  if ((fVar258 != fVar120) || (NAN(fVar258) || NAN(fVar120))) {
    auVar248 = vminss_avx(auVar248,auVar279);
    auVar239 = vmaxss_avx(auVar279,auVar239);
  }
  auVar248 = vmaxss_avx(auVar184,auVar248);
  auVar73 = vminss_avx(auVar239,auVar279);
  if (auVar73._0_4_ < auVar248._0_4_) goto LAB_015ae1ec;
  auVar248 = vmaxss_avx(auVar184,ZEXT416((uint)(auVar248._0_4_ + -0.1)));
  auVar279 = vminss_avx(ZEXT416((uint)(auVar73._0_4_ + 0.1)),auVar279);
  auVar138._0_8_ = auVar196._0_8_;
  auVar138._8_8_ = auVar138._0_8_;
  auVar212._8_8_ = local_4a0._0_8_;
  auVar212._0_8_ = local_4a0._0_8_;
  auVar229._8_8_ = local_4c0._0_8_;
  auVar229._0_8_ = local_4c0._0_8_;
  auVar73 = vshufpd_avx(local_4a0._0_16_,local_4a0._0_16_,3);
  auVar179 = vshufpd_avx(local_4c0._0_16_,local_4c0._0_16_,3);
  auVar239 = vshufps_avx(auVar248,auVar279,0);
  auVar196 = vsubps_avx(auVar99,auVar239);
  local_5e0._0_4_ = auVar111._0_4_;
  local_5e0._4_4_ = auVar111._4_4_;
  fStack_5d8 = auVar111._8_4_;
  fStack_5d4 = auVar111._12_4_;
  fVar120 = auVar239._0_4_;
  auVar75._0_4_ = fVar120 * (float)local_5e0._0_4_;
  fVar86 = auVar239._4_4_;
  auVar75._4_4_ = fVar86 * (float)local_5e0._4_4_;
  fVar88 = auVar239._8_4_;
  auVar75._8_4_ = fVar88 * fStack_5d8;
  fVar159 = auVar239._12_4_;
  auVar75._12_4_ = fVar159 * fStack_5d4;
  auVar173._0_4_ = fVar120 * auVar73._0_4_;
  auVar173._4_4_ = fVar86 * auVar73._4_4_;
  auVar173._8_4_ = fVar88 * auVar73._8_4_;
  auVar173._12_4_ = fVar159 * auVar73._12_4_;
  auVar185._0_4_ = fVar120 * auVar179._0_4_;
  auVar185._4_4_ = fVar86 * auVar179._4_4_;
  auVar185._8_4_ = fVar88 * auVar179._8_4_;
  auVar185._12_4_ = fVar159 * auVar179._12_4_;
  local_5c0 = auVar92._0_4_;
  fStack_5bc = auVar92._4_4_;
  fStack_5b8 = auVar92._8_4_;
  fStack_5b4 = auVar92._12_4_;
  auVar200._0_4_ = fVar120 * local_5c0;
  auVar200._4_4_ = fVar86 * fStack_5bc;
  auVar200._8_4_ = fVar88 * fStack_5b8;
  auVar200._12_4_ = fVar159 * fStack_5b4;
  auVar73 = vfmadd231ps_fma(auVar75,auVar196,auVar138);
  auVar179 = vfmadd231ps_fma(auVar173,auVar196,auVar212);
  auVar239 = vfmadd231ps_fma(auVar185,auVar196,auVar229);
  auVar196 = vfmadd231ps_fma(auVar200,auVar196,ZEXT816(0));
  auVar111 = vmovshdup_avx(auVar68);
  auVar270 = vfmadd231ss_fma(ZEXT416((uint)(auVar111._0_4_ * auVar248._0_4_)),auVar68,
                             ZEXT416((uint)(1.0 - auVar248._0_4_)));
  auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar111._0_4_ * auVar279._0_4_)),auVar68,
                            ZEXT416((uint)(1.0 - auVar279._0_4_)));
  fVar120 = 1.0 / fVar87;
  auVar279 = vsubps_avx(auVar179,auVar73);
  auVar213._0_4_ = auVar279._0_4_ * 3.0;
  auVar213._4_4_ = auVar279._4_4_ * 3.0;
  auVar213._8_4_ = auVar279._8_4_ * 3.0;
  auVar213._12_4_ = auVar279._12_4_ * 3.0;
  auVar279 = vsubps_avx(auVar239,auVar179);
  auVar230._0_4_ = auVar279._0_4_ * 3.0;
  auVar230._4_4_ = auVar279._4_4_ * 3.0;
  auVar230._8_4_ = auVar279._8_4_ * 3.0;
  auVar230._12_4_ = auVar279._12_4_ * 3.0;
  auVar279 = vsubps_avx(auVar196,auVar239);
  auVar240._0_4_ = auVar279._0_4_ * 3.0;
  auVar240._4_4_ = auVar279._4_4_ * 3.0;
  auVar240._8_4_ = auVar279._8_4_ * 3.0;
  auVar240._12_4_ = auVar279._12_4_ * 3.0;
  auVar111 = vminps_avx(auVar230,auVar240);
  auVar279 = vmaxps_avx(auVar230,auVar240);
  auVar111 = vminps_avx(auVar213,auVar111);
  auVar279 = vmaxps_avx(auVar213,auVar279);
  auVar92 = vshufpd_avx(auVar111,auVar111,3);
  auVar248 = vshufpd_avx(auVar279,auVar279,3);
  auVar111 = vminps_avx(auVar111,auVar92);
  auVar279 = vmaxps_avx(auVar279,auVar248);
  auVar231._0_4_ = auVar111._0_4_ * fVar120;
  auVar231._4_4_ = auVar111._4_4_ * fVar120;
  auVar231._8_4_ = auVar111._8_4_ * fVar120;
  auVar231._12_4_ = auVar111._12_4_ * fVar120;
  auVar214._0_4_ = auVar279._0_4_ * fVar120;
  auVar214._4_4_ = auVar279._4_4_ * fVar120;
  auVar214._8_4_ = auVar279._8_4_ * fVar120;
  auVar214._12_4_ = auVar279._12_4_ * fVar120;
  fVar120 = 1.0 / (auVar68._0_4_ - auVar270._0_4_);
  auVar279 = vshufpd_avx(auVar73,auVar73,3);
  auVar111 = vshufpd_avx(auVar179,auVar179,3);
  auVar92 = vshufpd_avx(auVar239,auVar239,3);
  auVar248 = vshufpd_avx(auVar196,auVar196,3);
  auVar279 = vsubps_avx(auVar279,auVar73);
  auVar73 = vsubps_avx(auVar111,auVar179);
  auVar179 = vsubps_avx(auVar92,auVar239);
  auVar248 = vsubps_avx(auVar248,auVar196);
  auVar111 = vminps_avx(auVar279,auVar73);
  auVar279 = vmaxps_avx(auVar279,auVar73);
  auVar92 = vminps_avx(auVar179,auVar248);
  auVar92 = vminps_avx(auVar111,auVar92);
  auVar111 = vmaxps_avx(auVar179,auVar248);
  auVar279 = vmaxps_avx(auVar279,auVar111);
  auVar263._0_4_ = fVar120 * auVar92._0_4_;
  auVar263._4_4_ = fVar120 * auVar92._4_4_;
  auVar263._8_4_ = fVar120 * auVar92._8_4_;
  auVar263._12_4_ = fVar120 * auVar92._12_4_;
  auVar249._0_4_ = fVar120 * auVar279._0_4_;
  auVar249._4_4_ = fVar120 * auVar279._4_4_;
  auVar249._8_4_ = fVar120 * auVar279._8_4_;
  auVar249._12_4_ = fVar120 * auVar279._12_4_;
  auVar248 = vinsertps_avx(auVar7,auVar270,0x10);
  auVar73 = vinsertps_avx(auVar8,auVar68,0x10);
  auVar241._0_4_ = (auVar248._0_4_ + auVar73._0_4_) * 0.5;
  auVar241._4_4_ = (auVar248._4_4_ + auVar73._4_4_) * 0.5;
  auVar241._8_4_ = (auVar248._8_4_ + auVar73._8_4_) * 0.5;
  auVar241._12_4_ = (auVar248._12_4_ + auVar73._12_4_) * 0.5;
  auVar76._4_4_ = auVar241._0_4_;
  auVar76._0_4_ = auVar241._0_4_;
  auVar76._8_4_ = auVar241._0_4_;
  auVar76._12_4_ = auVar241._0_4_;
  auVar279 = vfmadd213ps_fma(local_370,auVar76,auVar10);
  auVar111 = vfmadd213ps_fma(local_380,auVar76,auVar11);
  auVar92 = vfmadd213ps_fma(local_390,auVar76,auVar12);
  auVar8 = vsubps_avx(auVar111,auVar279);
  auVar279 = vfmadd213ps_fma(auVar8,auVar76,auVar279);
  auVar8 = vsubps_avx(auVar92,auVar111);
  auVar8 = vfmadd213ps_fma(auVar8,auVar76,auVar111);
  auVar8 = vsubps_avx(auVar8,auVar279);
  auVar279 = vfmadd231ps_fma(auVar279,auVar8,auVar76);
  auVar77._0_8_ = CONCAT44(auVar8._4_4_ * 3.0,auVar8._0_4_ * 3.0);
  auVar77._8_4_ = auVar8._8_4_ * 3.0;
  auVar77._12_4_ = auVar8._12_4_ * 3.0;
  auVar273._8_8_ = auVar279._0_8_;
  auVar273._0_8_ = auVar279._0_8_;
  auVar8 = vshufpd_avx(auVar279,auVar279,3);
  auVar279 = vshufps_avx(auVar241,auVar241,0x55);
  auVar239 = vsubps_avx(auVar8,auVar273);
  auVar208 = vfmadd231ps_fma(auVar273,auVar279,auVar239);
  auVar280._8_8_ = auVar77._0_8_;
  auVar280._0_8_ = auVar77._0_8_;
  auVar8 = vshufpd_avx(auVar77,auVar77,3);
  auVar8 = vsubps_avx(auVar8,auVar280);
  auVar196 = vfmadd213ps_fma(auVar8,auVar279,auVar280);
  auVar279 = vmovshdup_avx(auVar196);
  auVar281._0_8_ = auVar279._0_8_ ^ 0x8000000080000000;
  auVar281._8_4_ = auVar279._8_4_ ^ 0x80000000;
  auVar281._12_4_ = auVar279._12_4_ ^ 0x80000000;
  auVar111 = vmovshdup_avx(auVar239);
  auVar8 = vunpcklps_avx(auVar111,auVar281);
  auVar92 = vshufps_avx(auVar8,auVar281,4);
  auVar179 = vshufps_avx(auVar241,auVar241,0x54);
  auVar128._0_8_ = auVar239._0_8_ ^ 0x8000000080000000;
  auVar128._8_4_ = auVar239._8_4_ ^ 0x80000000;
  auVar128._12_4_ = auVar239._12_4_ ^ 0x80000000;
  auVar8 = vmovlhps_avx(auVar128,auVar196);
  auVar8 = vshufps_avx(auVar8,auVar196,8);
  auVar279 = vfmsub231ss_fma(ZEXT416((uint)(auVar239._0_4_ * auVar279._0_4_)),auVar111,auVar196);
  uVar60 = auVar279._0_4_;
  auVar78._4_4_ = uVar60;
  auVar78._0_4_ = uVar60;
  auVar78._8_4_ = uVar60;
  auVar78._12_4_ = uVar60;
  auVar279 = vdivps_avx(auVar92,auVar78);
  auVar111 = vdivps_avx(auVar8,auVar78);
  fVar88 = auVar208._0_4_;
  fVar120 = auVar279._0_4_;
  auVar8 = vshufps_avx(auVar208,auVar208,0x55);
  fVar86 = auVar111._0_4_;
  auVar79._0_4_ = fVar88 * fVar120 + auVar8._0_4_ * fVar86;
  auVar79._4_4_ = fVar88 * auVar279._4_4_ + auVar8._4_4_ * auVar111._4_4_;
  auVar79._8_4_ = fVar88 * auVar279._8_4_ + auVar8._8_4_ * auVar111._8_4_;
  auVar79._12_4_ = fVar88 * auVar279._12_4_ + auVar8._12_4_ * auVar111._12_4_;
  auVar269 = vsubps_avx(auVar179,auVar79);
  auVar179 = vmovshdup_avx(auVar279);
  auVar8 = vinsertps_avx(auVar231,auVar263,0x1c);
  auVar150._0_4_ = auVar179._0_4_ * auVar8._0_4_;
  auVar150._4_4_ = auVar179._4_4_ * auVar8._4_4_;
  auVar150._8_4_ = auVar179._8_4_ * auVar8._8_4_;
  auVar150._12_4_ = auVar179._12_4_ * auVar8._12_4_;
  auVar92 = vinsertps_avx(auVar214,auVar249,0x1c);
  auVar100._0_4_ = auVar92._0_4_ * auVar179._0_4_;
  auVar100._4_4_ = auVar92._4_4_ * auVar179._4_4_;
  auVar100._8_4_ = auVar92._8_4_ * auVar179._8_4_;
  auVar100._12_4_ = auVar92._12_4_ * auVar179._12_4_;
  auVar208 = vminps_avx(auVar150,auVar100);
  auVar196 = vmaxps_avx(auVar100,auVar150);
  auVar179 = vinsertps_avx(auVar263,auVar231,0x4c);
  auVar124 = vmovshdup_avx(auVar111);
  auVar239 = vinsertps_avx(auVar249,auVar214,0x4c);
  auVar250._0_4_ = auVar124._0_4_ * auVar179._0_4_;
  auVar250._4_4_ = auVar124._4_4_ * auVar179._4_4_;
  auVar250._8_4_ = auVar124._8_4_ * auVar179._8_4_;
  auVar250._12_4_ = auVar124._12_4_ * auVar179._12_4_;
  auVar232._0_4_ = auVar124._0_4_ * auVar239._0_4_;
  auVar232._4_4_ = auVar124._4_4_ * auVar239._4_4_;
  auVar232._8_4_ = auVar124._8_4_ * auVar239._8_4_;
  auVar232._12_4_ = auVar124._12_4_ * auVar239._12_4_;
  auVar124 = vminps_avx(auVar250,auVar232);
  auVar264._0_4_ = auVar208._0_4_ + auVar124._0_4_;
  auVar264._4_4_ = auVar208._4_4_ + auVar124._4_4_;
  auVar264._8_4_ = auVar208._8_4_ + auVar124._8_4_;
  auVar264._12_4_ = auVar208._12_4_ + auVar124._12_4_;
  auVar208 = vmaxps_avx(auVar232,auVar250);
  auVar101._0_4_ = auVar208._0_4_ + auVar196._0_4_;
  auVar101._4_4_ = auVar208._4_4_ + auVar196._4_4_;
  auVar101._8_4_ = auVar208._8_4_ + auVar196._8_4_;
  auVar101._12_4_ = auVar208._12_4_ + auVar196._12_4_;
  auVar233._8_8_ = 0x3f80000000000000;
  auVar233._0_8_ = 0x3f80000000000000;
  auVar196 = vsubps_avx(auVar233,auVar101);
  auVar208 = vsubps_avx(auVar233,auVar264);
  auVar124 = vsubps_avx(auVar248,auVar241);
  auVar237 = vsubps_avx(auVar73,auVar241);
  auVar116._0_4_ = fVar120 * auVar8._0_4_;
  auVar116._4_4_ = fVar120 * auVar8._4_4_;
  auVar116._8_4_ = fVar120 * auVar8._8_4_;
  auVar116._12_4_ = fVar120 * auVar8._12_4_;
  auVar265._0_4_ = fVar120 * auVar92._0_4_;
  auVar265._4_4_ = fVar120 * auVar92._4_4_;
  auVar265._8_4_ = fVar120 * auVar92._8_4_;
  auVar265._12_4_ = fVar120 * auVar92._12_4_;
  auVar92 = vminps_avx(auVar116,auVar265);
  auVar8 = vmaxps_avx(auVar265,auVar116);
  auVar151._0_4_ = fVar86 * auVar179._0_4_;
  auVar151._4_4_ = fVar86 * auVar179._4_4_;
  auVar151._8_4_ = fVar86 * auVar179._8_4_;
  auVar151._12_4_ = fVar86 * auVar179._12_4_;
  auVar215._0_4_ = fVar86 * auVar239._0_4_;
  auVar215._4_4_ = fVar86 * auVar239._4_4_;
  auVar215._8_4_ = fVar86 * auVar239._8_4_;
  auVar215._12_4_ = fVar86 * auVar239._12_4_;
  auVar179 = vminps_avx(auVar151,auVar215);
  auVar266._0_4_ = auVar92._0_4_ + auVar179._0_4_;
  auVar266._4_4_ = auVar92._4_4_ + auVar179._4_4_;
  auVar266._8_4_ = auVar92._8_4_ + auVar179._8_4_;
  auVar266._12_4_ = auVar92._12_4_ + auVar179._12_4_;
  fVar258 = auVar124._0_4_;
  auVar274._0_4_ = fVar258 * auVar196._0_4_;
  fVar259 = auVar124._4_4_;
  auVar274._4_4_ = fVar259 * auVar196._4_4_;
  fVar190 = auVar124._8_4_;
  auVar274._8_4_ = fVar190 * auVar196._8_4_;
  fVar191 = auVar124._12_4_;
  auVar274._12_4_ = fVar191 * auVar196._12_4_;
  auVar92 = vmaxps_avx(auVar215,auVar151);
  auVar216._0_4_ = fVar258 * auVar208._0_4_;
  auVar216._4_4_ = fVar259 * auVar208._4_4_;
  auVar216._8_4_ = fVar190 * auVar208._8_4_;
  auVar216._12_4_ = fVar191 * auVar208._12_4_;
  fVar88 = auVar237._0_4_;
  auVar102._0_4_ = fVar88 * auVar196._0_4_;
  fVar159 = auVar237._4_4_;
  auVar102._4_4_ = fVar159 * auVar196._4_4_;
  fVar61 = auVar237._8_4_;
  auVar102._8_4_ = fVar61 * auVar196._8_4_;
  fVar222 = auVar237._12_4_;
  auVar102._12_4_ = fVar222 * auVar196._12_4_;
  auVar234._0_4_ = fVar88 * auVar208._0_4_;
  auVar234._4_4_ = fVar159 * auVar208._4_4_;
  auVar234._8_4_ = fVar61 * auVar208._8_4_;
  auVar234._12_4_ = fVar222 * auVar208._12_4_;
  auVar117._0_4_ = auVar8._0_4_ + auVar92._0_4_;
  auVar117._4_4_ = auVar8._4_4_ + auVar92._4_4_;
  auVar117._8_4_ = auVar8._8_4_ + auVar92._8_4_;
  auVar117._12_4_ = auVar8._12_4_ + auVar92._12_4_;
  auVar152._8_8_ = 0x3f800000;
  auVar152._0_8_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar152,auVar117);
  auVar92 = vsubps_avx(auVar152,auVar266);
  auVar267._0_4_ = fVar258 * auVar8._0_4_;
  auVar267._4_4_ = fVar259 * auVar8._4_4_;
  auVar267._8_4_ = fVar190 * auVar8._8_4_;
  auVar267._12_4_ = fVar191 * auVar8._12_4_;
  auVar251._0_4_ = fVar258 * auVar92._0_4_;
  auVar251._4_4_ = fVar259 * auVar92._4_4_;
  auVar251._8_4_ = fVar190 * auVar92._8_4_;
  auVar251._12_4_ = fVar191 * auVar92._12_4_;
  auVar118._0_4_ = fVar88 * auVar8._0_4_;
  auVar118._4_4_ = fVar159 * auVar8._4_4_;
  auVar118._8_4_ = fVar61 * auVar8._8_4_;
  auVar118._12_4_ = fVar222 * auVar8._12_4_;
  auVar153._0_4_ = fVar88 * auVar92._0_4_;
  auVar153._4_4_ = fVar159 * auVar92._4_4_;
  auVar153._8_4_ = fVar61 * auVar92._8_4_;
  auVar153._12_4_ = fVar222 * auVar92._12_4_;
  auVar8 = vminps_avx(auVar267,auVar251);
  auVar92 = vminps_avx(auVar118,auVar153);
  auVar8 = vminps_avx(auVar8,auVar92);
  auVar92 = vmaxps_avx(auVar251,auVar267);
  auVar179 = vmaxps_avx(auVar153,auVar118);
  auVar239 = vminps_avx(auVar274,auVar216);
  auVar196 = vminps_avx(auVar102,auVar234);
  auVar239 = vminps_avx(auVar239,auVar196);
  auVar8 = vhaddps_avx(auVar8,auVar239);
  auVar92 = vmaxps_avx(auVar179,auVar92);
  auVar179 = vmaxps_avx(auVar216,auVar274);
  auVar239 = vmaxps_avx(auVar234,auVar102);
  auVar179 = vmaxps_avx(auVar239,auVar179);
  auVar92 = vhaddps_avx(auVar92,auVar179);
  auVar8 = vshufps_avx(auVar8,auVar8,0xe8);
  auVar92 = vshufps_avx(auVar92,auVar92,0xe8);
  auVar235._0_4_ = auVar269._0_4_ + auVar8._0_4_;
  auVar235._4_4_ = auVar269._4_4_ + auVar8._4_4_;
  auVar235._8_4_ = auVar269._8_4_ + auVar8._8_4_;
  auVar235._12_4_ = auVar269._12_4_ + auVar8._12_4_;
  auVar217._0_4_ = auVar269._0_4_ + auVar92._0_4_;
  auVar217._4_4_ = auVar269._4_4_ + auVar92._4_4_;
  auVar217._8_4_ = auVar269._8_4_ + auVar92._8_4_;
  auVar217._12_4_ = auVar269._12_4_ + auVar92._12_4_;
  auVar220 = ZEXT1664(auVar217);
  auVar8 = vmaxps_avx(auVar248,auVar235);
  auVar92 = vminps_avx(auVar217,auVar73);
  auVar8 = vcmpps_avx(auVar92,auVar8,1);
  auVar8 = vshufps_avx(auVar8,auVar8,0x50);
  if ((auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar8[0xf] < '\0')
  goto LAB_015ae1ec;
  bVar50 = 0;
  if ((auVar189._0_4_ < auVar235._0_4_) && (bVar50 = 0, auVar217._0_4_ < auVar73._0_4_)) {
    auVar92 = vmovshdup_avx(auVar235);
    auVar8 = vcmpps_avx(auVar217,auVar73,1);
    bVar50 = auVar8[4] & auVar270._0_4_ < auVar92._0_4_;
  }
  if (((3 < (uint)uVar49 || fVar87 < 0.001) | bVar50) == 1) {
    lVar52 = 200;
    auVar220 = ZEXT1664(auVar12);
    do {
      fVar159 = auVar269._0_4_;
      fVar88 = 1.0 - fVar159;
      fVar87 = fVar88 * fVar88 * fVar88;
      fVar89 = fVar159 * 3.0 * fVar88 * fVar88;
      fVar88 = fVar88 * fVar159 * fVar159 * 3.0;
      auVar139._4_4_ = fVar87;
      auVar139._0_4_ = fVar87;
      auVar139._8_4_ = fVar87;
      auVar139._12_4_ = fVar87;
      auVar119._4_4_ = fVar89;
      auVar119._0_4_ = fVar89;
      auVar119._8_4_ = fVar89;
      auVar119._12_4_ = fVar89;
      auVar103._4_4_ = fVar88;
      auVar103._0_4_ = fVar88;
      auVar103._8_4_ = fVar88;
      auVar103._12_4_ = fVar88;
      fVar159 = fVar159 * fVar159 * fVar159;
      auVar154._0_4_ = (float)local_3a0._0_4_ * fVar159;
      auVar154._4_4_ = (float)local_3a0._4_4_ * fVar159;
      auVar154._8_4_ = fStack_398 * fVar159;
      auVar154._12_4_ = fStack_394 * fVar159;
      auVar7 = vfmadd231ps_fma(auVar154,auVar12,auVar103);
      auVar7 = vfmadd231ps_fma(auVar7,auVar11,auVar119);
      auVar7 = vfmadd231ps_fma(auVar7,auVar10,auVar139);
      auVar104._8_8_ = auVar7._0_8_;
      auVar104._0_8_ = auVar7._0_8_;
      auVar7 = vshufpd_avx(auVar7,auVar7,3);
      auVar8 = vshufps_avx(auVar269,auVar269,0x55);
      auVar7 = vsubps_avx(auVar7,auVar104);
      auVar8 = vfmadd213ps_fma(auVar7,auVar8,auVar104);
      fVar87 = auVar8._0_4_;
      auVar7 = vshufps_avx(auVar8,auVar8,0x55);
      auVar105._0_4_ = fVar120 * fVar87 + fVar86 * auVar7._0_4_;
      auVar105._4_4_ = auVar279._4_4_ * fVar87 + auVar111._4_4_ * auVar7._4_4_;
      auVar105._8_4_ = auVar279._8_4_ * fVar87 + auVar111._8_4_ * auVar7._8_4_;
      auVar105._12_4_ = auVar279._12_4_ * fVar87 + auVar111._12_4_ * auVar7._12_4_;
      auVar269 = vsubps_avx(auVar269,auVar105);
      auVar7 = vandps_avx(auVar244,auVar8);
      auVar8 = vshufps_avx(auVar7,auVar7,0xf5);
      auVar7 = vmaxss_avx(auVar8,auVar7);
      if (auVar7._0_4_ < fVar85) {
        local_120 = auVar269._0_4_;
        if ((0.0 <= local_120) && (local_120 <= 1.0)) {
          auVar7 = vmovshdup_avx(auVar269);
          fVar87 = auVar7._0_4_;
          if ((0.0 <= fVar87) && (fVar87 <= 1.0)) {
            auVar8 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                   ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
            auVar239 = vinsertps_avx(auVar8,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                    );
            auVar8 = vdpps_avx(auVar239,auVar63,0x7f);
            auVar279 = vdpps_avx(auVar239,auVar94,0x7f);
            auVar111 = vdpps_avx(auVar239,local_3b0,0x7f);
            auVar92 = vdpps_avx(auVar239,local_3c0,0x7f);
            auVar248 = vdpps_avx(auVar239,local_3d0,0x7f);
            auVar73 = vdpps_avx(auVar239,local_3e0,0x7f);
            auVar179 = vdpps_avx(auVar239,local_3f0,0x7f);
            auVar239 = vdpps_avx(auVar239,local_400,0x7f);
            fVar89 = 1.0 - fVar87;
            auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * auVar248._0_4_)),ZEXT416((uint)fVar89),
                                     auVar8);
            auVar279 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar87)),ZEXT416((uint)fVar89)
                                       ,auVar279);
            auVar220 = ZEXT1664(auVar279);
            auVar111 = vfmadd231ss_fma(ZEXT416((uint)(auVar179._0_4_ * fVar87)),
                                       ZEXT416((uint)fVar89),auVar111);
            auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * auVar239._0_4_)),ZEXT416((uint)fVar89)
                                      ,auVar92);
            fVar86 = 1.0 - local_120;
            fVar87 = fVar86 * local_120 * local_120 * 3.0;
            fVar159 = local_120 * local_120 * local_120;
            auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * auVar92._0_4_)),
                                       ZEXT416((uint)fVar87),auVar111);
            fVar89 = local_120 * 3.0 * fVar86 * fVar86;
            auVar279 = vfmadd231ss_fma(auVar111,ZEXT416((uint)fVar89),auVar279);
            fVar120 = fVar86 * fVar86 * fVar86;
            auVar8 = vfmadd231ss_fma(auVar279,ZEXT416((uint)fVar120),auVar8);
            fVar88 = auVar8._0_4_;
            if ((fVar59 <= fVar88) && (fVar61 = *(float *)(ray + k * 4 + 0x100), fVar88 <= fVar61))
            {
              pGVar3 = (context->scene->geometries).items[uVar47].ptr;
              if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_015af005:
                bVar50 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar50 = 1, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar8 = vshufps_avx(auVar269,auVar269,0x55);
                auVar218._8_4_ = 0x3f800000;
                auVar218._0_8_ = 0x3f8000003f800000;
                auVar218._12_4_ = 0x3f800000;
                auVar279 = vsubps_avx(auVar218,auVar8);
                fVar222 = auVar8._0_4_;
                auVar236._0_4_ = fVar222 * auVar226._0_4_;
                fVar258 = auVar8._4_4_;
                auVar236._4_4_ = fVar258 * auVar226._4_4_;
                fVar259 = auVar8._8_4_;
                auVar236._8_4_ = fVar259 * auVar226._8_4_;
                fVar190 = auVar8._12_4_;
                auVar236._12_4_ = fVar190 * auVar226._12_4_;
                auVar242._0_4_ = fVar222 * auVar66._0_4_;
                auVar242._4_4_ = fVar258 * auVar66._4_4_;
                auVar242._8_4_ = fVar259 * auVar66._8_4_;
                auVar242._12_4_ = fVar190 * auVar66._12_4_;
                local_5a0 = auVar121._0_4_;
                fStack_59c = auVar121._4_4_;
                fStack_598 = auVar121._8_4_;
                fStack_594 = auVar121._12_4_;
                auVar252._0_4_ = fVar222 * local_5a0;
                auVar252._4_4_ = fVar258 * fStack_59c;
                auVar252._8_4_ = fVar259 * fStack_598;
                auVar252._12_4_ = fVar190 * fStack_594;
                auVar201._0_4_ = fVar222 * fVar158;
                auVar201._4_4_ = fVar258 * fVar176;
                auVar201._8_4_ = fVar259 * fVar177;
                auVar201._12_4_ = fVar190 * fVar178;
                auVar8 = vfmadd231ps_fma(auVar236,auVar279,auVar65);
                auVar111 = vfmadd231ps_fma(auVar242,auVar279,auVar122);
                auVar92 = vfmadd231ps_fma(auVar252,auVar279,auVar93);
                auVar248 = vfmadd231ps_fma(auVar201,auVar279,auVar64);
                auVar279 = vsubps_avx(auVar111,auVar8);
                auVar220 = ZEXT1664(auVar279);
                auVar8 = vsubps_avx(auVar92,auVar111);
                auVar111 = vsubps_avx(auVar248,auVar92);
                auVar253._0_4_ = local_120 * auVar8._0_4_;
                auVar253._4_4_ = local_120 * auVar8._4_4_;
                auVar253._8_4_ = local_120 * auVar8._8_4_;
                auVar253._12_4_ = local_120 * auVar8._12_4_;
                auVar186._4_4_ = fVar86;
                auVar186._0_4_ = fVar86;
                auVar186._8_4_ = fVar86;
                auVar186._12_4_ = fVar86;
                auVar92 = vfmadd231ps_fma(auVar253,auVar186,auVar279);
                auVar202._0_4_ = local_120 * auVar111._0_4_;
                auVar202._4_4_ = local_120 * auVar111._4_4_;
                auVar202._8_4_ = local_120 * auVar111._8_4_;
                auVar202._12_4_ = local_120 * auVar111._12_4_;
                auVar8 = vfmadd231ps_fma(auVar202,auVar186,auVar8);
                auVar203._0_4_ = local_120 * auVar8._0_4_;
                auVar203._4_4_ = local_120 * auVar8._4_4_;
                auVar203._8_4_ = local_120 * auVar8._8_4_;
                auVar203._12_4_ = local_120 * auVar8._12_4_;
                auVar111 = vfmadd231ps_fma(auVar203,auVar186,auVar92);
                auVar174._0_4_ = fVar159 * (float)local_460._0_4_;
                auVar174._4_4_ = fVar159 * (float)local_460._4_4_;
                auVar174._8_4_ = fVar159 * fStack_458;
                auVar174._12_4_ = fVar159 * fStack_454;
                auVar129._4_4_ = fVar87;
                auVar129._0_4_ = fVar87;
                auVar129._8_4_ = fVar87;
                auVar129._12_4_ = fVar87;
                auVar8 = vfmadd132ps_fma(auVar129,auVar174,local_450);
                auVar155._4_4_ = fVar89;
                auVar155._0_4_ = fVar89;
                auVar155._8_4_ = fVar89;
                auVar155._12_4_ = fVar89;
                auVar8 = vfmadd132ps_fma(auVar155,auVar8,local_440);
                auVar130._0_4_ = auVar111._0_4_ * 3.0;
                auVar130._4_4_ = auVar111._4_4_ * 3.0;
                auVar130._8_4_ = auVar111._8_4_ * 3.0;
                auVar130._12_4_ = auVar111._12_4_ * 3.0;
                auVar140._4_4_ = fVar120;
                auVar140._0_4_ = fVar120;
                auVar140._8_4_ = fVar120;
                auVar140._12_4_ = fVar120;
                auVar111 = vfmadd132ps_fma(auVar140,auVar8,local_430);
                auVar8 = vshufps_avx(auVar130,auVar130,0xc9);
                auVar156._0_4_ = auVar111._0_4_ * auVar8._0_4_;
                auVar156._4_4_ = auVar111._4_4_ * auVar8._4_4_;
                auVar156._8_4_ = auVar111._8_4_ * auVar8._8_4_;
                auVar156._12_4_ = auVar111._12_4_ * auVar8._12_4_;
                auVar8 = vshufps_avx(auVar111,auVar111,0xc9);
                auVar111 = vfmsub231ps_fma(auVar156,auVar130,auVar8);
                auVar8 = vmovshdup_avx(auVar111);
                local_180 = auVar8._0_8_;
                uStack_178 = local_180;
                uStack_170 = local_180;
                uStack_168 = local_180;
                auVar8 = vshufps_avx(auVar111,auVar111,0xaa);
                local_160 = auVar8._0_8_;
                uStack_158 = local_160;
                uStack_150 = local_160;
                uStack_148 = local_160;
                local_140 = auVar111._0_4_;
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                fStack_11c = local_120;
                fStack_118 = local_120;
                fStack_114 = local_120;
                fStack_110 = local_120;
                fStack_10c = local_120;
                fStack_108 = local_120;
                fStack_104 = local_120;
                local_100 = auVar7._0_8_;
                uStack_f8 = local_100;
                uStack_f0 = local_100;
                uStack_e8 = local_100;
                local_e0 = CONCAT44(uStack_2dc,local_2e0);
                uStack_d8 = CONCAT44(uStack_2d4,uStack_2d8);
                uStack_d0 = CONCAT44(uStack_2cc,uStack_2d0);
                uStack_c8 = CONCAT44(uStack_2c4,uStack_2c8);
                local_c0._4_4_ = uStack_2bc;
                local_c0._0_4_ = local_2c0;
                local_c0._8_4_ = uStack_2b8;
                local_c0._12_4_ = uStack_2b4;
                local_c0._16_4_ = uStack_2b0;
                local_c0._20_4_ = uStack_2ac;
                local_c0._24_4_ = uStack_2a8;
                local_c0._28_4_ = uStack_2a4;
                vpcmpeqd_avx2(local_c0,local_c0);
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                *(float *)(ray + k * 4 + 0x100) = fVar88;
                local_480 = local_300;
                local_4f0.valid = (int *)local_480;
                local_4f0.geometryUserPtr = pGVar3->userPtr;
                local_4f0.context = context->user;
                local_4f0.ray = (RTCRayN *)ray;
                local_4f0.hit = (RTCHitN *)&local_180;
                local_4f0.N = 8;
                if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar220 = ZEXT1664(auVar279);
                  (*pGVar3->occlusionFilterN)(&local_4f0);
                }
                auVar81 = vpcmpeqd_avx2(local_480,_DAT_01faff00);
                auVar81 = _DAT_01fe9960 & ~auVar81;
                if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar81 >> 0x7f,0) != '\0') ||
                      (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar81 >> 0xbf,0) != '\0') ||
                    (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar81[0x1f] < '\0') {
                  p_Var4 = context->args->filter;
                  if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar220 = ZEXT1664(auVar220._0_16_);
                    (*p_Var4)(&local_4f0);
                  }
                  auVar14 = vpcmpeqd_avx2(local_480,_DAT_01faff00);
                  auVar110._8_4_ = 0xff800000;
                  auVar110._0_8_ = 0xff800000ff800000;
                  auVar110._12_4_ = 0xff800000;
                  auVar110._16_4_ = 0xff800000;
                  auVar110._20_4_ = 0xff800000;
                  auVar110._24_4_ = 0xff800000;
                  auVar110._28_4_ = 0xff800000;
                  auVar81 = vblendvps_avx(auVar110,*(undefined1 (*) [32])(local_4f0.ray + 0x100),
                                          auVar14);
                  *(undefined1 (*) [32])(local_4f0.ray + 0x100) = auVar81;
                  auVar81 = _DAT_01fe9960 & ~auVar14;
                  if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar81 >> 0x7f,0) != '\0') ||
                        (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar81 >> 0xbf,0) != '\0') ||
                      (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar81[0x1f] < '\0') {
                    bVar50 = 1;
                    goto LAB_015af007;
                  }
                }
                *(float *)(ray + k * 4 + 0x100) = fVar61;
                goto LAB_015af005;
              }
LAB_015af007:
              bVar58 = (bool)(bVar58 | bVar50);
            }
          }
        }
        break;
      }
      lVar52 = lVar52 + -1;
    } while (lVar52 != 0);
    goto LAB_015ae1ec;
  }
  local_410 = vinsertps_avx(auVar7,ZEXT416((uint)fVar89),0x10);
  auVar68 = vinsertps_avx(auVar270,ZEXT416((uint)auVar68._0_4_),0x10);
  goto LAB_015adc2e;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }